

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::RALocalAllocator::makeInitialAssignment(RALocalAllocator *this)

{
  byte *pbVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  BaseRAPass *pBVar5;
  BaseCompiler *pBVar6;
  BaseNode *node;
  void *__src;
  long *plVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Layout *pLVar11;
  RAAssignment *pRVar12;
  undefined4 workId;
  RegGroup RVar13;
  uint32_t uVar14;
  Error EVar15;
  long lVar16;
  FuncNode *pFVar17;
  RAStackSlot *pRVar18;
  FuncNode *pFVar19;
  RABlock *pRVar20;
  byte bVar21;
  int iVar22;
  FuncNode *pFVar23;
  FuncNode *pFVar24;
  FuncNode *pFVar25;
  FuncNode *pFVar26;
  FuncNode *pFVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long *extraout_RDX;
  RABlock *block;
  long unaff_RBX;
  FuncNode *pFVar32;
  PhysToWorkMap *pPVar33;
  ulong unaff_RBP;
  FuncNode *pFVar34;
  uint *puVar35;
  uint uVar36;
  RALocalAllocator *in_RSI;
  RALocalAllocator *pRVar37;
  FuncNode *pFVar38;
  InstNode *node_00;
  uint uVar39;
  FuncNode *pFVar40;
  ulong uVar41;
  FuncNode *pFVar42;
  FuncNode *pFVar43;
  FuncNode *pFVar44;
  FuncNode *pFVar45;
  FuncNode *unaff_R12;
  uint uVar46;
  uint uVar47;
  FuncNode *unaff_R13;
  FuncNode *unaff_R14;
  FuncNode *pFVar48;
  FuncNode *pFVar49;
  int iVar50;
  FuncNode *unaff_R15;
  ulong uVar51;
  undefined7 uVar54;
  FuncNode *pFVar52;
  InstNode *pIVar53;
  bool bVar55;
  char cVar56;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined8 uStack_560;
  undefined8 uStack_558;
  PhysToWorkMap *pPStack_548;
  FuncNode *pFStack_540;
  FuncNode *pFStack_538;
  FuncNode *pFStack_530;
  InstNode *pIStack_528;
  uint *puStack_520;
  Error EStack_514;
  ulong uStack_510;
  FuncNode *pFStack_508;
  InstNode *pIStack_500;
  FuncNode *pFStack_4f8;
  FuncNode *pFStack_4f0;
  FuncNode *pFStack_4e8;
  FuncNode *pFStack_4e0;
  FuncNode *pFStack_4d8;
  FuncNode *pFStack_4d0;
  FuncNode *pFStack_4c8;
  FuncNode *pFStack_4c0;
  FuncNode *pFStack_4b8;
  FuncNode *pFStack_4b0;
  FuncNode *pFStack_4a8;
  FuncNode *pFStack_4a0;
  code *pcStack_498;
  code *pcStack_490;
  uint uStack_484;
  FuncNode *pFStack_480;
  FuncNode *pFStack_478;
  FuncNode *pFStack_470;
  uint uStack_464;
  undefined8 uStack_460;
  FuncNode *pFStack_458;
  uint uStack_450;
  uint uStack_44c;
  FuncNode *pFStack_448;
  FuncNode *pFStack_440;
  uint uStack_438;
  uint uStack_434;
  FuncNode *pFStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  uint uStack_414;
  FuncNode *pFStack_410;
  ulong uStack_408;
  FuncNode *pFStack_400;
  undefined1 auStack_3f8 [48];
  FuncNode *pFStack_3c8;
  uint **ppuStack_3c0;
  undefined8 auStack_3b8 [32];
  undefined8 auStack_2b8 [33];
  FuncNode *pFStack_1b0;
  ulong uStack_1a8;
  ulong uStack_1a0;
  FuncNode *pFStack_198;
  FuncNode *pFStack_190;
  ulong uStack_188;
  FuncNode *pFStack_180;
  FuncNode *pFStack_178;
  FuncNode *pFStack_170;
  FuncNode *pFStack_168;
  FuncNode *pFStack_160;
  FuncNode *pFStack_158;
  ulong uStack_150;
  uint uStack_13c;
  FuncNode *pFStack_138;
  FuncNode *pFStack_130;
  uint uStack_124;
  FuncNode *pFStack_120;
  uint uStack_114;
  ulong uStack_110;
  long *plStack_108;
  uint32_t uStack_fc;
  undefined1 auStack_f8 [24];
  FuncNode *pFStack_e0;
  FuncNode *pFStack_d8;
  ulong auStack_d0 [2];
  LabelNode *pLStack_c0;
  SentinelNode *pSStack_b8;
  FuncNode *pFStack_b0;
  FuncNode *pFStack_a8;
  FuncNode *pFStack_a0;
  FuncNode *pFStack_98;
  FuncNode *pFStack_90;
  ulong uStack_88;
  long lStack_80;
  long local_70;
  ulong local_68;
  FuncNode *local_60;
  RALocalAllocator *local_58;
  ulong local_50;
  int local_48;
  uint local_44;
  FuncNode *local_40;
  undefined1 *local_38;
  
  pBVar5 = this->_pass;
  if (*(int *)&pBVar5->field_0xb8 != 0) {
    unaff_R12 = pBVar5->_func;
    lVar16 = **(long **)&pBVar5->_blocks;
    local_38 = (undefined1 *)
               (ulong)*(byte *)&((RAAssignment *)&unaff_R12->field_0x90)->_workToPhysMap;
    local_40 = (FuncNode *)&this->_curAssignment;
    local_50 = 0;
    uVar36 = 1;
    pRVar37 = this;
    local_70 = lVar16;
    local_58 = this;
    do {
      if (local_38 == (undefined1 *)0x0) {
        bVar21 = 0;
      }
      else {
        pFVar27 = (FuncNode *)0x0;
        unaff_R14 = (FuncNode *)0x0;
        do {
          unaff_RBX = 4;
          unaff_R15 = pFVar27;
          uVar30 = uVar36;
          do {
            unaff_RBP = (ulong)uVar30;
            if (*(byte *)&((RAAssignment *)&unaff_R12->field_0x90)->_workToPhysMap <=
                (byte)unaff_R14) {
              lStack_80 = 0x122c89;
              makeInitialAssignment();
LAB_00122c89:
              lStack_80 = 0x122c8e;
              makeInitialAssignment();
LAB_00122c8e:
              lStack_80 = 0x122c93;
              makeInitialAssignment();
LAB_00122c93:
              lStack_80 = 0x122c98;
              makeInitialAssignment();
LAB_00122c98:
              lStack_80 = 0x122c9d;
              makeInitialAssignment();
LAB_00122c9d:
              lStack_80 = 0x122ca2;
              makeInitialAssignment();
LAB_00122ca2:
              lStack_80 = 0x122ca7;
              makeInitialAssignment();
LAB_00122ca7:
              lStack_80 = 0x122cac;
              makeInitialAssignment();
              goto LAB_00122cac;
            }
            iVar22 = 10;
            uVar36 = uVar30;
            if (*(int *)((long)&(*(ArgPack **)((long)(&unaff_R12->_frame + 1) + 0x14))->_data[0].
                                _signature._bits + (long)unaff_R15 * 2) != 0) {
              pBVar6 = pRVar37->_cc;
              uVar29 = *(int *)((long)&(*(ArgPack **)((long)(&unaff_R12->_frame + 1) + 0x14))->_data
                                       [0]._id + (long)unaff_R15 * 2) - 0x100;
              if (uVar29 < *(uint *)&pBVar6->field_0x1f0) {
                if (*(uint *)&pBVar6->field_0x1f0 <= uVar29) goto LAB_00122c89;
                unaff_R13 = *(FuncNode **)
                             (*(long *)(*(long *)&pBVar6->_vRegArray + (ulong)uVar29 * 8) + 0x28);
                if (unaff_R13 != (FuncNode *)0x0) {
                  uVar29 = (((Layout *)&unaff_R13->super_LabelNode)->physIndex).super_RARegCount.
                           field_0._packed;
                  if (*(uint *)(lVar16 + 0x80) <= uVar29) goto LAB_00122c8e;
                  in_RSI = (RALocalAllocator *)(ulong)(uVar29 >> 6);
                  if ((*(ulong *)(*(long *)(lVar16 + 0x78) + (long)in_RSI * 8) >>
                       ((ulong)uVar29 & 0x3f) & 1) != 0) {
                    if (uVar29 == 0xffffffff) goto LAB_00122c93;
                    if ((pRVar37->_curAssignment)._layout.workCount <= uVar29) goto LAB_00122c98;
                    if ((pRVar37->_curAssignment)._workToPhysMap[uVar29].physIds[0] != 0xff)
                    goto LAB_00122aa6;
                    RVar13 = *(RegGroup *)
                              ((long)(((RARegMask *)&unaff_R13->field_0x18)->_masks)._data + 9) &
                             kMaxValue;
                    if (kExtraVirt3 < RVar13) goto LAB_00122c9d;
                    in_RSI = (RALocalAllocator *)(ulong)RVar13;
                    uVar39 = ~*(uint *)((long)(((pRVar37->_curAssignment)._physToWorkMap)->assigned)
                                              ._masks._data + (ulong)((uint)RVar13 * 4)) &
                             *(uint *)((long)(pRVar37->_availableRegs)._masks._data +
                                      (ulong)((uint)RVar13 * 4));
                    this = (RALocalAllocator *)(ulong)uVar39;
                    if ((int)local_50 == 0) {
                      bVar21 = (((RAAssignment *)&unaff_R13->field_0x48)->_layout).physIndex.
                               super_RARegCount.field_0._regs[2];
                      local_68 = (ulong)bVar21;
                      lVar16 = local_70;
                      uVar36 = 2;
                      iVar22 = 0;
                      if ((bVar21 != 0xff) && ((uVar39 >> (bVar21 & 0x1f) & 1) != 0)) {
                        lStack_80 = 0x122bba;
                        this = (RALocalAllocator *)local_40;
                        local_60 = pFVar27;
                        RAAssignment::assign
                                  ((RAAssignment *)local_40,RVar13,uVar29,(uint)bVar21,true);
                        if (unaff_R14 < (FuncNode *)0x20) {
                          uVar36 = (int)local_68 << 0x10 |
                                   (*(uint *)((long)(((RARegMask *)&unaff_R13->field_0x18)->_masks).
                                                    _data + 8) & 0xf8) << 0x15;
                          *(uint *)((undefined1 *)
                                    ((long)&(local_58->_pass->super_FuncPass).super_Pass._vptr_Pass
                                    + 4) + (long)(&unaff_R15->field_0x200 + 0x28)) =
                               *(byte *)((long)&((*(BaseCompiler **)&unaff_R13->field_0x8)->
                                                super_BaseBuilder).super_BaseEmitter.
                                                _validationFlags + 1) + uVar36 + 0x100;
                          iVar22 = 10;
                          goto LAB_00122b5b;
                        }
                        goto LAB_00122ca7;
                      }
                    }
                    else if (uVar39 == 0) {
                      lStack_80 = 0x122c25;
                      this = (RALocalAllocator *)unaff_R13;
                      local_60 = pFVar27;
                      makeInitialAssignment();
                      in_RSI = pRVar37;
                      pRVar37 = local_58;
                      lVar16 = local_70;
                      pFVar27 = local_60;
                      uVar36 = local_44;
                      iVar22 = local_48;
                    }
                    else {
                      uVar36 = 0;
                      if (uVar39 != 0) {
                        for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                        }
                      }
                      local_68 = (ulong)uVar36;
                      lStack_80 = 0x122b19;
                      this = (RALocalAllocator *)local_40;
                      local_60 = pFVar27;
                      RAAssignment::assign((RAAssignment *)local_40,RVar13,uVar29,uVar36,true);
                      if ((FuncNode *)0x1f < unaff_R14) goto LAB_00122ca2;
                      uVar36 = (int)local_68 << 0x10 |
                               (*(uint *)((long)(((RARegMask *)&unaff_R13->field_0x18)->_masks).
                                                _data + 8) & 0xf8) << 0x15;
                      *(uint *)((undefined1 *)
                                ((long)&(local_58->_pass->super_FuncPass).super_Pass._vptr_Pass + 4)
                               + (long)(&unaff_R15->field_0x200 + 0x28)) =
                           *(byte *)((long)&((*(BaseCompiler **)&unaff_R13->field_0x8)->
                                            super_BaseBuilder).super_BaseEmitter._validationFlags +
                                    1) + uVar36 + 0x100;
                      iVar22 = 0;
LAB_00122b5b:
                      in_RSI = (RALocalAllocator *)(ulong)uVar36;
                      pRVar37 = local_58;
                      lVar16 = local_70;
                      pFVar27 = local_60;
                      uVar36 = uVar30;
                    }
                  }
                }
              }
            }
LAB_00122aa6:
            if ((iVar22 != 10) && (iVar22 != 0)) {
              bVar21 = 0;
              goto LAB_00122c3d;
            }
            unaff_R15 = (FuncNode *)&unaff_R15->field_0x4;
            unaff_RBX = unaff_RBX + -1;
            uVar30 = uVar36;
          } while (unaff_RBX != 0);
          bVar21 = 1;
LAB_00122c3d:
          if (bVar21 == 0) break;
          unaff_R14 = (FuncNode *)&unaff_R14->field_0x1;
          pFVar27 = (FuncNode *)&pFVar27->field_0x10;
        } while (unaff_R14 != (FuncNode *)local_38);
        bVar21 = bVar21 ^ 1;
      }
      if ((bVar21 != 0) || (uVar30 = (int)local_50 + 1, local_50 = (ulong)uVar30, uVar36 <= uVar30))
      {
        return (Error)bVar21;
      }
    } while( true );
  }
LAB_00122cac:
  lStack_80 = 0x122cb1;
  makeInitialAssignment();
  uStack_88 = 0x122cca;
  lStack_80 = unaff_RBX;
  memcpy(((RAAssignment *)&((FuncNode *)this)->field_0x48)->_physToWorkMap,in_RSI,
         (ulong)(((RAAssignment *)&((FuncNode *)this)->field_0x48)->_layout).physTotal * 4 + 0x20);
  uStack_88 = 0x122cdb;
  memset(((RAAssignment *)&((FuncNode *)this)->field_0x48)->_workToPhysMap,0xff,
         (ulong)(((RAAssignment *)&((FuncNode *)this)->field_0x48)->_layout).workCount);
  lVar16 = 0;
  uStack_fc = 0xffffffff;
  while (uVar36 = (((RAAssignment *)&((FuncNode *)this)->field_0x48)->_physToWorkMap->assigned).
                  _masks._data[lVar16], uVar36 == 0) {
LAB_00122d1b:
    lVar16 = lVar16 + 1;
    if (lVar16 == 4) {
      return 0;
    }
  }
  bVar21 = *(byte *)((long)(((RAAssignment *)&((FuncNode *)this)->field_0x48)->_physToWorkIds)._data
                    + lVar16 + -0x28);
  pFVar27 = (FuncNode *)(ulong)bVar21;
  while( true ) {
    uVar30 = 0;
    if (uVar36 != 0) {
      for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
      }
    }
    pFVar25 = (FuncNode *)(ulong)uVar30;
    uVar29 = ((RAAssignment *)&((FuncNode *)this)->field_0x48)->_physToWorkMap->workIds
             [uVar30 + bVar21];
    if ((ulong)uVar29 == 0xffffffff) break;
    ((RAAssignment *)&((FuncNode *)this)->field_0x48)->_workToPhysMap[uVar29].physIds[0] =
         (uint8_t)uVar30;
    uVar36 = uVar36 - 1 & uVar36;
    if (uVar36 == 0) goto LAB_00122d1b;
  }
  uStack_88 = 0x122d2d;
  replaceAssignment();
  auStack_d0[1] = 0;
  pLStack_c0 = (LabelNode *)0x0;
  pFStack_d8 = (FuncNode *)0x0;
  auStack_d0[0] = 0;
  auStack_f8._16_8_ = 0;
  pFStack_e0 = (FuncNode *)0x0;
  auStack_f8._0_8_ = 0;
  auStack_f8._8_8_ = 0;
  pSStack_b8 = (SentinelNode *)0x0;
  lVar16 = *(long *)&pFVar25->super_LabelNode;
  uVar36 = (uint)*(byte *)(lVar16 + 0x10d) + (uint)*(byte *)(lVar16 + 0x10c);
  pFVar19 = (FuncNode *)(ulong)uVar36;
  pFVar42 = (FuncNode *)this;
  uStack_114 = uVar29;
  pFStack_b0 = (FuncNode *)this;
  pFStack_a8 = unaff_R12;
  pFStack_a0 = unaff_R13;
  pFStack_98 = unaff_R14;
  pFStack_90 = unaff_R15;
  uStack_88 = unaff_RBP;
  if (0xff < uVar36) goto LAB_0012360a;
  uVar30 = *(byte *)(lVar16 + 0x10e) + uVar36;
  if (0xff < uVar30) goto LAB_0012360f;
  pFStack_120 = (FuncNode *)&pFVar25->field_0x48;
  auStack_f8._16_8_ = lVar16 + 0x140;
  auStack_f8._0_4_ = uVar30 * 0x1000000 | uVar36 * 0x10000 | (uint)*(byte *)(lVar16 + 0x10c) << 8;
  auStack_f8._4_4_ = *(uint *)(lVar16 + 0x10c);
  auStack_f8._12_4_ = *(uint *)(lVar16 + 0x148);
  auStack_f8._8_4_ = (*(uint *)(lVar16 + 0x10c) >> 0x18) + ((uint)auStack_f8._0_4_ >> 0x18);
  pFVar23 = *(FuncNode **)&pFVar25->field_0xf8;
  lVar16 = 0;
  do {
    uVar41 = (long)(((RARegMask *)&pFVar27->field_0x18)->_masks)._data +
             (ulong)((uint)auStack_f8._0_4_ >> ((byte)lVar16 & 0x1f) & 0xff) * 4 + 8;
    *(ulong *)((long)auStack_d0 + lVar16) = uVar41;
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0x20);
  pFVar38 = (FuncNode *)0xff;
  uStack_150 = 0x122e57;
  pFStack_138 = pFVar25;
  plStack_108 = extraout_RDX;
  pFStack_e0 = pFVar23;
  pFStack_d8 = pFVar27;
  memset(pFVar23,0xff,(ulong)(uint)auStack_f8._12_4_);
  lVar16 = 0;
LAB_00122e5e:
  uVar36 = *(uint *)((long)(((RARegMask *)&pFStack_d8->field_0x18)->_masks)._data +
                    lVar16 * 4 + -0x18);
  if (uVar36 == 0) goto LAB_00122e9e;
  bVar21 = auStack_f8[lVar16];
  pFVar38 = (FuncNode *)(ulong)bVar21;
  while( true ) {
    uVar30 = 0;
    if (uVar36 != 0) {
      for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
      }
    }
    pFVar23 = (FuncNode *)(ulong)uVar30;
    pFVar19 = (FuncNode *)(ulong)(uVar30 + bVar21);
    uVar41 = (ulong)*(uint *)((long)(((RARegMask *)&pFStack_d8->field_0x18)->_masks)._data +
                             (long)pFVar19 * 4 + 8);
    if (uVar41 == 0xffffffff) break;
    *(char *)((long)(((RARegMask *)&pFStack_e0->field_0x18)->_masks)._data + (uVar41 - 0x18)) =
         (char)uVar30;
    uVar36 = uVar36 - 1 & uVar36;
    if (uVar36 == 0) goto LAB_00122e9e;
  }
  uStack_150 = 0x1235b5;
  switchToAssignment();
LAB_001235b5:
  uStack_150 = 0x1235ba;
  switchToAssignment();
LAB_001235ba:
  uStack_150 = 0x1235bf;
  switchToAssignment();
  pFVar42 = unaff_R14;
LAB_001235bf:
  uStack_150 = 0x1235c4;
  switchToAssignment();
LAB_001235c4:
  uStack_150 = 0x1235c9;
  switchToAssignment();
  pFVar25 = pFVar23;
  unaff_R14 = pFVar42;
LAB_001235c9:
  uStack_150 = 0x1235ce;
  switchToAssignment();
  pFVar23 = pFVar25;
  pFVar42 = unaff_R12;
LAB_001235ce:
  uStack_150 = 0x1235d3;
  switchToAssignment();
LAB_001235d3:
  uStack_150 = 0x1235d8;
  switchToAssignment();
  pFVar25 = pFVar23;
  unaff_R12 = pFVar42;
LAB_001235d8:
  uStack_150 = 0x1235dd;
  switchToAssignment();
LAB_001235dd:
  uStack_150 = 0x1235e2;
  switchToAssignment();
LAB_001235e2:
  uStack_150 = 0x1235e7;
  switchToAssignment();
  pFVar23 = pFVar25;
LAB_001235e7:
  uStack_150 = 0x1235ec;
  switchToAssignment();
LAB_001235ec:
  uStack_150 = 0x1235f1;
  switchToAssignment();
LAB_001235f1:
  uStack_150 = 0x1235f6;
  switchToAssignment();
LAB_001235f6:
  pFVar42 = (FuncNode *)this;
  uStack_150 = 0x1235fb;
  switchToAssignment();
LAB_001235fb:
  uStack_150 = 0x123600;
  switchToAssignment();
  uStack_150 = 0x123605;
  switchToAssignment();
  uStack_150 = 0x12360a;
  switchToAssignment();
  pFVar27 = pFVar38;
  pFVar25 = pFVar23;
LAB_0012360a:
  uStack_150 = 0x12360f;
  switchToAssignment();
  this = (RALocalAllocator *)pFVar42;
LAB_0012360f:
  uVar36 = (uint)pFVar27;
  uStack_150 = 0x123614;
  switchToAssignment();
  goto LAB_00123614;
LAB_00122e9e:
  lVar16 = lVar16 + 1;
  if (lVar16 == 4) goto code_r0x00122ea7;
  goto LAB_00122e5e;
code_r0x00122ea7:
  pFVar19 = (FuncNode *)0x0;
  pFVar27 = pFStack_138;
LAB_00122eb5:
  pFStack_130 = pFVar19;
  if ((byte)uStack_114 == '\0') {
    uVar36 = (((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap->assigned)._masks._data
             [(long)pFVar19];
    unaff_R14 = (FuncNode *)(ulong)uVar36;
    unaff_R15 = (FuncNode *)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    if (uVar36 == 0) {
      bVar55 = true;
    }
    else {
      do {
        uVar36 = 0;
        uVar30 = (uint)unaff_R14;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        this = (RALocalAllocator *)(ulong)uVar36;
        uVar29 = *(uint *)(*(long *)(&pFVar27->field_0x48 + (long)pFVar19 * 8 + 0x28) +
                          (long)this * 4);
        unaff_R12 = (FuncNode *)(ulong)uVar29;
        pFVar25 = pFVar23;
        if (unaff_R12 == (FuncNode *)0xffffffff) goto LAB_001235dd;
        if (*(uint *)(plStack_108 + 1) <= uVar29) goto LAB_001235e2;
        unaff_RBP = uVar41 & 0xffffffff;
        uVar41 = unaff_RBP;
        if ((*(ulong *)(*plStack_108 + (ulong)(uVar29 >> 6) * 8) >> ((ulong)unaff_R12 & 0x3f) & 1)
            == 0) {
          pFVar38 = (FuncNode *)((ulong)pFVar19 & 0xff);
          uStack_150 = 0x122fa6;
          pFVar23 = pFStack_120;
          RAAssignment::unassign((RAAssignment *)pFStack_120,(RegGroup)pFVar19,uVar29,uVar36);
          bVar21 = 4;
          pFVar19 = pFStack_130;
          pFVar27 = pFStack_138;
        }
        else {
          if ((uint)auStack_f8._12_4_ <= uVar29) goto LAB_001235e7;
          bVar21 = 0;
          if (*(char *)((long)(((RARegMask *)&unaff_R12->field_0x18)->_masks)._data +
                       (long)&pFStack_e0[-1]._exitNode) != -1) goto LAB_00122fbe;
          if ((*(uint *)(*(long *)(&pFVar27->field_0x48 + 0x20) + 0x10 + (long)pFVar19 * 4) >>
               (uVar36 & 0x1f) & 1) == 0) {
LAB_00122f5e:
            pFVar38 = (FuncNode *)((ulong)pFVar19 & 0xff);
            uStack_150 = 0x122f71;
            pFVar27 = pFStack_120;
            RAAssignment::unassign((RAAssignment *)pFStack_120,(RegGroup)pFVar19,uVar29,uVar36);
            uVar39 = 0;
          }
          else {
            pFVar38 = (FuncNode *)((ulong)pFVar19 & 0xff);
            uStack_150 = 0x122f50;
            uVar39 = onSaveReg((RALocalAllocator *)pFVar27,(RegGroup)pFVar19,uVar29,uVar36);
            pFVar19 = pFStack_130;
            if (uVar39 == 0) goto LAB_00122f5e;
          }
          bVar21 = uVar39 != 0;
          pFVar23 = pFVar27;
          pFVar19 = pFStack_130;
          pFVar27 = pFStack_138;
          if ((bool)bVar21) {
            uVar41 = (ulong)uVar39;
          }
        }
LAB_00122fbe:
        if ((bVar21 & 3) != 0) goto LAB_00122fd5;
        uVar30 = uVar30 - 1 & uVar30;
        unaff_R14 = (FuncNode *)(ulong)uVar30;
      } while (uVar30 != 0);
      bVar21 = 0;
LAB_00122fd5:
      bVar55 = bVar21 == 0;
    }
    if (bVar55) goto LAB_00122fe6;
  }
  else {
LAB_00122fe6:
    unaff_R14 = (FuncNode *)
                (ulong)*(uint *)((long)(((RARegMask *)&pFStack_d8->field_0x18)->_masks)._data +
                                (long)pFVar19 * 4 + -0x18);
    pFVar38 = (FuncNode *)0xffffffff;
    uVar28 = 0;
    do {
      if ((int)unaff_R14 == 0) {
LAB_0012342f:
        uStack_124 = (uint)pFVar19 & 0xff;
        pFVar42 = pFVar27;
        goto LAB_00123437;
      }
      uVar36 = (int)pFVar38 + 1;
      pFVar38 = (FuncNode *)(ulong)uVar36;
      if (uVar36 == 2) {
        if ((byte)uStack_114 != '\0') goto LAB_0012342f;
        uVar41 = 3;
        break;
      }
      uStack_110 = uVar28;
      unaff_R15 = unaff_R14;
      do {
        uVar29 = (uint)pFVar38;
        uVar36 = 0;
        uVar30 = (uint)unaff_R15;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        this = (RALocalAllocator *)(ulong)uVar36;
        uVar46 = 1 << ((byte)uVar36 & 0x1f);
        unaff_R13 = (FuncNode *)(ulong)uVar46;
        uVar39 = *(uint *)(auStack_d0[(long)pFVar19] + (ulong)(uVar36 * 4));
        unaff_RBP = (ulong)uVar39;
        if (unaff_RBP == 0xffffffff) goto LAB_001235b5;
        uVar47 = *(uint *)((long)(((RAAssignment *)&pFVar27->field_0x48)->_physToWorkIds)._data
                                 [(long)pFVar19] + (ulong)(uVar36 * 4));
        unaff_R12 = (FuncNode *)(ulong)uVar47;
        pFVar42 = unaff_R14;
        if (uVar47 == 0xffffffff) {
LAB_0012324b:
          if ((((RAAssignment *)&pFVar27->field_0x48)->_layout).workCount <= uVar39)
          goto LAB_001235c4;
          bVar21 = ((RAAssignment *)&pFVar27->field_0x48)->_workToPhysMap[unaff_RBP].physIds[0];
          unaff_R14 = (FuncNode *)(ulong)bVar21;
          if (bVar21 == 0xff) {
            if (*(uint *)(plStack_108 + 1) <= uVar39) goto LAB_001235d3;
            uVar29 = 0;
            if ((*(ulong *)(*plStack_108 + (ulong)(uVar39 >> 6) * 8) >> (unaff_RBP & 0x3f) & 1) != 0
               ) {
              uVar29 = uVar46;
            }
            uStack_110 = (ulong)((uint)uStack_110 | uVar29);
            cVar56 = '\f';
            unaff_R14 = (FuncNode *)(ulong)((uint)pFVar42 & ~uVar46);
          }
          else {
            uVar29 = 0;
            if (uVar36 != bVar21) {
              uStack_124 = (uint)pFVar38;
              uStack_13c = (uint)uVar41;
              uStack_150 = 0x12328f;
              RAAssignment::reassign
                        ((RAAssignment *)pFStack_120,(RegGroup)pFVar19,uVar39,uVar36,(uint)bVar21);
              pFVar23 = *(FuncNode **)&pFStack_138->super_LabelNode;
              uStack_150 = 0x1232a4;
              uVar29 = (**(code **)(*(long *)&pFVar23->super_LabelNode + 0x48))
                                 (pFVar23,uVar39,uVar36,bVar21);
              pFVar38 = (FuncNode *)(ulong)uStack_124;
              uVar41 = (ulong)uStack_13c;
              pFVar19 = pFStack_130;
              pFVar27 = pFStack_138;
            }
            cVar56 = uVar29 != 0;
            uVar41 = uVar41 & 0xffffffff;
            unaff_R14 = pFVar42;
            if ((bool)cVar56) {
              uVar41 = (ulong)uVar29;
            }
          }
          uVar29 = (uint)pFVar38;
          unaff_R12 = pFVar42;
          if (cVar56 != '\0') goto LAB_001233f7;
LAB_00123322:
          pFVar23 = pFVar27;
          unaff_R12 = (FuncNode *)(ulong)uVar29;
          uVar29 = *(uint *)((long)(((RARegMask *)&pFStack_d8->field_0x18)->_masks)._data +
                            (long)pFVar19 * 4 + -8);
          pFVar38 = *(FuncNode **)(&pFVar23->field_0x48 + 0x20);
          uVar47 = *(uint *)((long)(((RARegMask *)&pFVar38->field_0x18)->_masks)._data +
                            (long)pFVar19 * 4 + -8);
          pFVar25 = (FuncNode *)(ulong)(uVar47 ^ uVar29);
          pFVar27 = pFVar23;
          if (((uVar47 ^ uVar29) & uVar46) != 0) {
            if ((uVar29 & uVar46) == 0) {
              if ((uVar47 & uVar46) == 0) goto LAB_001235d8;
              if ((char)uStack_fc != '\0') {
                pFVar38 = (FuncNode *)((ulong)pFVar19 & 0xff);
                unaff_RBP = uVar41 & 0xffffffff;
                uStack_150 = 0x12337e;
                EVar15 = onSaveReg((RALocalAllocator *)pFVar23,(RegGroup)pFVar19,uVar39,uVar36);
                uVar41 = uVar41 & 0xffffffff;
                cVar56 = '\x01';
                pFVar25 = pFVar23;
                pFVar19 = pFStack_130;
                pFVar27 = pFStack_138;
                if (EVar15 != 0) {
                  uVar41 = (ulong)EVar15;
                  pFVar38 = unaff_R12;
                  goto LAB_001233f7;
                }
                goto LAB_001233b0;
              }
              lVar16 = (long)(((RARegMask *)&pFStack_d8->field_0x18)->_masks)._data +
                       (long)pFVar19 * 4 + -0x18;
            }
            else {
              if ((uVar47 & uVar46) != 0) goto LAB_001235c9;
              lVar16 = (long)(((RARegMask *)&pFVar38->field_0x18)->_masks)._data +
                       (long)pFVar19 * 4 + -0x18;
              uVar29 = uVar47;
            }
            *(uint *)(lVar16 + 0x10) = uVar29 | uVar46;
          }
LAB_001233b0:
          pFVar23 = pFVar25;
          this = (RALocalAllocator *)(ulong)(uVar36 << 2);
          if (*(int *)((long)(((RARegMask *)&((FuncNode *)this)->field_0x18)->_masks)._data +
                      (auStack_d0[(long)pFVar19] - 0x18)) !=
              *(int *)((long)(((RARegMask *)&((FuncNode *)this)->field_0x18)->_masks)._data +
                      (long)((((RAAssignment *)&pFVar27->field_0x48)->_physToWorkIds)._data
                             [(long)pFVar19] + -6))) goto LAB_001235ba;
          pFVar42 = unaff_R14;
          if (((*(uint *)((long)(((RARegMask *)&pFStack_d8->field_0x18)->_masks)._data +
                         (long)pFVar19 * 4 + -8) & uVar46) != 0) !=
              (((((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap->dirty)._masks._data
                [(long)pFVar19] & uVar46) != 0)) goto LAB_001235bf;
          unaff_R13 = (FuncNode *)(ulong)~uVar46;
          unaff_R14 = (FuncNode *)(ulong)((uint)unaff_R14 & ~uVar46);
          cVar56 = '\0';
          pFVar38 = (FuncNode *)0xffffffff;
        }
        else {
          if (uVar47 == uVar39) goto LAB_00123322;
          if ((int)uVar29 < 1) {
            cVar56 = '\f';
          }
          else {
            pFVar42 = unaff_R12;
            if ((((RAAssignment *)&pFVar27->field_0x48)->_layout).workCount <= uVar39)
            goto LAB_001235ce;
            uStack_124 = (uint)unaff_R14;
            bVar21 = ((RAAssignment *)&pFVar27->field_0x48)->_workToPhysMap[unaff_RBP].physIds[0];
            if (bVar21 == 0xff) {
              cVar56 = '\f';
            }
            else {
              uStack_13c = (uint)uVar41;
              RVar13 = (RegGroup)pFVar19;
              if ((((*(ArchTraits **)&pFVar27->field_0x10)[-1]._typeIdToRegType._data + 0x1c)
                   [(long)(((Array<unsigned_int_*,_4UL> *)((RARegMask *)&pFVar19->field_0x18 + 1))->
                           _data + -2)] & kLabelTag) == kNone) {
                pPVar33 = ((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap;
                if (((pPVar33->dirty)._masks._data[(long)pFVar19] & uVar46) == 0) {
                  uStack_150 = 0x1231bd;
                  pFVar23 = pFStack_120;
                  RAAssignment::unassign((RAAssignment *)pFStack_120,RVar13,uVar47,uVar36);
                  cVar56 = '\x18';
                  uVar41 = (ulong)uStack_13c;
                }
                else {
                  uVar31 = ~(pPVar33->assigned)._masks._data[(long)pFVar19] &
                           *(uint *)(*(long *)&pFVar27->super_LabelNode + 0x118 + (long)pFVar19 * 4)
                  ;
                  uVar29 = ~*(uint *)((long)(((RARegMask *)&pFStack_d8->field_0x18)->_masks)._data +
                                     (long)pFVar19 * 4 + -0x18) & uVar31;
                  if (uVar29 == 0) {
                    uVar29 = uVar31;
                  }
                  if (uVar29 == 0) {
                    if (((((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap->dirty)._masks.
                         _data[(long)pFVar19] & uVar46) == 0) {
LAB_001231f3:
                      uStack_150 = 0x123206;
                      pFVar23 = pFStack_120;
                      RAAssignment::unassign((RAAssignment *)pFStack_120,RVar13,uVar47,uVar36);
                      uVar29 = 0;
                    }
                    else {
                      uStack_150 = 0x1231ef;
                      pFVar23 = pFStack_138;
                      uVar29 = onSaveReg((RALocalAllocator *)pFStack_138,RVar13,uVar47,uVar36);
                      if (uVar29 == 0) goto LAB_001231f3;
                    }
                    uVar47 = uStack_13c;
                    if (uVar29 != 0) {
                      uVar47 = uVar29;
                    }
                    uVar41 = (ulong)uVar47;
                    cVar56 = '\x01';
                    if (uVar29 == 0) {
                      cVar56 = '\x18';
                    }
                  }
                  else {
                    uVar14 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    uVar29 = 0;
                    if (uVar14 != uVar36) {
                      uStack_150 = 0x1230f2;
                      RAAssignment::reassign
                                ((RAAssignment *)pFStack_120,(RegGroup)pFStack_130,uVar47,uVar14,
                                 uVar36);
                      pFVar23 = *(FuncNode **)&pFStack_138->super_LabelNode;
                      uStack_150 = 0x123108;
                      uVar29 = (**(code **)(*(long *)&pFVar23->super_LabelNode + 0x48))
                                         (pFVar23,unaff_R12,uVar14,uVar36);
                    }
                    cVar56 = '\x01';
                    uVar47 = uStack_13c;
                    if (uVar29 != 0) {
                      uVar47 = uVar29;
                    }
                    uVar41 = (ulong)uVar47;
                    if (uVar29 == 0) {
                      puVar35 = (uint *)((long)((Array<unsigned_int_*,_4UL> *)
                                               &pFStack_138->field_0x28)->_data +
                                        (long)pFStack_130 * 4);
                      *puVar35 = *puVar35 | 1 << ((byte)uVar14 & 0x1f);
                      cVar56 = '\x18';
                    }
                  }
                }
                pFVar38 = (FuncNode *)0xffffffff;
              }
              else {
                uStack_150 = 0x123172;
                RAAssignment::swap((RAAssignment *)pFStack_120,RVar13,uVar47,uVar36,uVar39,
                                   (uint)bVar21);
                pFVar23 = *(FuncNode **)&pFStack_138->super_LabelNode;
                uStack_150 = 0x12318a;
                uVar47 = (**(code **)(*(long *)&pFVar23->super_LabelNode + 0x50))
                                   (pFVar23,unaff_R12,uVar36,unaff_RBP,bVar21);
                cVar56 = uVar47 != 0;
                uVar29 = uStack_13c;
                if ((bool)cVar56) {
                  uVar29 = uVar47;
                }
                uVar41 = (ulong)uVar29;
                pFVar38 = (FuncNode *)0xffffffff;
              }
            }
            uVar29 = (uint)pFVar38;
            unaff_R14 = (FuncNode *)(ulong)uStack_124;
            pFVar19 = pFStack_130;
            pFVar27 = pFStack_138;
            if (cVar56 == '\0') goto LAB_00123322;
            pFVar42 = unaff_R14;
            if (cVar56 == '\x18') goto LAB_0012324b;
          }
        }
LAB_001233f7:
        if ((cVar56 != '\f') && (cVar56 != '\0')) goto LAB_00123412;
        uVar30 = uVar30 - 1 & uVar30;
        unaff_R15 = (FuncNode *)(ulong)uVar30;
      } while (uVar30 != 0);
      cVar56 = '\0';
LAB_00123412:
      uVar28 = uStack_110;
    } while (cVar56 == '\0');
    unaff_R15 = (FuncNode *)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
  }
  goto LAB_00123569;
  while( true ) {
    uVar30 = 0;
    if (uVar36 != 0) {
      for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
      }
    }
    unaff_RBP = (ulong)uVar30;
    uVar36 = 1 << ((byte)uVar30 & 0x1f);
    unaff_R12 = (FuncNode *)(ulong)uVar36;
    if (((((RAAssignment *)&pFVar42->field_0x48)->_physToWorkMap->assigned)._masks._data
         [(long)pFVar19] >> (uVar30 & 0x1f) & 1) == 0) {
      uVar29 = *(uint *)(auStack_d0[(long)pFVar19] + unaff_RBP * 4);
      unaff_R14 = (FuncNode *)(ulong)uVar29;
      if (*(uint *)(plStack_108 + 1) <= uVar29) goto LAB_001235f1;
      if ((*(ulong *)(*plStack_108 + (ulong)(uVar29 >> 6) * 8) >> ((ulong)unaff_R14 & 0x3f) & 1) ==
          0) goto LAB_001235f6;
      uStack_13c = CONCAT31(uStack_13c._1_3_,bVar55);
      unaff_R13 = (FuncNode *)0x0;
      uVar51 = uVar41 & 0xffffffff;
      uStack_150 = 0x1234cb;
      uStack_110 = uVar28;
      RAAssignment::assign((RAAssignment *)pFStack_120,(RegGroup)uStack_124,uVar29,uVar30,false);
      pFVar23 = *(FuncNode **)&pFVar42->super_LabelNode;
      pFVar38 = (FuncNode *)(ulong)uVar29;
      uStack_150 = 0x1234d9;
      uVar30 = (**(code **)(*(long *)&pFVar23->super_LabelNode + 0x58))(pFVar23,pFVar38,uVar30);
      uVar41 = uVar51;
      if (uVar30 != 0) {
        uVar41 = (ulong)uVar30;
      }
      uVar54 = (undefined7)(uVar51 >> 8);
      uVar28 = uStack_110;
      this = (RALocalAllocator *)pFVar42;
      pFVar19 = pFStack_130;
      pFVar27 = pFStack_138;
      if (uVar30 == 0) {
        unaff_R15 = (FuncNode *)CONCAT71(uVar54,(undefined1)uStack_13c);
        if ((*(uint *)((long)(((RARegMask *)&pFStack_d8->field_0x18)->_masks)._data +
                      (long)pFStack_130 * 4 + -8) & uVar36) != 0) {
          puVar35 = (((RAAssignment *)&pFStack_138->field_0x48)->_physToWorkMap->dirty)._masks._data
                    + (long)pFStack_130;
          *puVar35 = *puVar35 | uVar36;
        }
        unaff_R13 = (FuncNode *)0x1;
        if (((*(uint *)((long)(((RARegMask *)&pFStack_d8->field_0x18)->_masks)._data +
                       (long)pFStack_130 * 4 + -8) & uVar36) != 0) !=
            (((((RAAssignment *)&pFStack_138->field_0x48)->_physToWorkMap->dirty)._masks._data
              [(long)pFStack_130] & uVar36) != 0)) goto LAB_001235fb;
      }
      else {
        unaff_R15 = (FuncNode *)CONCAT71(uVar54,(undefined1)uStack_13c);
      }
    }
    else {
      unaff_R13 = (FuncNode *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
      if ((byte)uStack_114 == '\0') goto LAB_001235ec;
    }
    uVar28 = (ulong)((uint)uVar28 - 1 & (uint)uVar28);
    pFVar42 = pFVar27;
    if ((char)unaff_R13 == '\0') break;
LAB_00123437:
    uVar36 = (uint)uVar28;
    bVar55 = uVar36 != 0;
    unaff_R15 = (FuncNode *)CONCAT71((int7)((ulong)unaff_R15 >> 8),bVar55);
    pFVar27 = pFVar42;
    if (uVar36 == 0) break;
  }
LAB_00123569:
  EVar15 = (Error)uVar41;
  if ((byte)unaff_R15 != 0) goto LAB_0012357e;
  pFVar19 = (FuncNode *)&pFVar19->field_0x1;
  if (pFVar19 == (FuncNode *)0x4) goto code_r0x0012357b;
  goto LAB_00122eb5;
code_r0x0012357b:
  EVar15 = 0;
LAB_0012357e:
  bVar21 = (byte)unaff_R15 | (byte)uStack_114;
  unaff_R15 = (FuncNode *)CONCAT71((int7)((ulong)unaff_R15 >> 8),bVar21);
  if (bVar21 != 0) {
    return EVar15;
  }
  pFVar25 = (FuncNode *)auStack_f8;
  uStack_150 = 0x123594;
  pFVar27 = pFStack_120;
  bVar55 = RAAssignment::equals((RAAssignment *)pFVar25,(RAAssignment *)pFStack_120);
  uVar36 = (uint)pFVar27;
  if (bVar55) {
    return 0;
  }
LAB_00123614:
  uStack_150 = 0x123619;
  switchToAssignment();
  uStack_150 = unaff_RBP;
  pFStack_158 = unaff_R15;
  pFStack_160 = unaff_R14;
  pFStack_168 = unaff_R13;
  pFStack_170 = unaff_R12;
  pFStack_178 = (FuncNode *)this;
  pFStack_180 = (FuncNode *)&pFVar25->field_0x48;
  pFVar27 = pFVar25;
  while( true ) {
    if (uVar36 == 0) {
      this = (RALocalAllocator *)0x0;
      goto LAB_001236e8;
    }
    uVar30 = 0;
    if (uVar36 != 0) {
      for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
      }
    }
    uVar29 = 1 << ((byte)uVar30 & 0x1f);
    if (((((RAAssignment *)&pFVar25->field_0x48)->_physToWorkMap->assigned)._masks._data[0] >>
         (uVar30 & 0x1f) & 1) != 0) break;
    bVar55 = true;
LAB_001236d1:
    uVar36 = uVar36 - 1 & uVar36;
    if (!bVar55) {
LAB_001236e8:
      return (Error)this;
    }
  }
  pPVar33 = ((RAAssignment *)&pFVar25->field_0x48)->_physToWorkMap;
  pFVar42 = (FuncNode *)(ulong)uVar30;
  uVar39 = (((RAAssignment *)&pFVar25->field_0x48)->_physToWorkIds)._data[0][(long)pFVar42];
  uVar41 = (ulong)uVar39;
  uVar46 = (pPVar33->dirty)._masks._data[0];
  if ((uVar46 & uVar29) == 0) {
LAB_001236b0:
    unaff_R15 = (FuncNode *)0x0;
    uStack_188 = 0x1236c3;
    pFVar27 = pFStack_180;
    RAAssignment::unassign((RAAssignment *)pFStack_180,k0,uVar39,uVar30);
LAB_001236c3:
    bVar55 = (int)unaff_R15 == 0;
    this = (RALocalAllocator *)((ulong)this & 0xffffffff);
    if (!bVar55) {
      this = (RALocalAllocator *)unaff_R15;
    }
    goto LAB_001236d1;
  }
  if (uVar39 == 0xffffffff) {
    uStack_188 = 0x1236fe;
    spillScratchGpRegsBeforeEntry();
LAB_001236fe:
    uStack_188 = 0x123703;
    spillScratchGpRegsBeforeEntry();
LAB_00123703:
    uStack_188 = 0x123708;
    spillScratchGpRegsBeforeEntry();
  }
  else {
    if ((((RAAssignment *)&pFVar25->field_0x48)->_layout).workCount <= uVar39) goto LAB_001236fe;
    bVar21 = ((RAAssignment *)&pFVar25->field_0x48)->_workToPhysMap[uVar41].physIds[0];
    pFVar27 = (FuncNode *)(ulong)bVar21;
    if (uVar30 != bVar21) goto LAB_00123703;
    pFVar27 = (FuncNode *)(((RAAssignment *)&pFVar25->field_0x48)->_physToWorkIds)._data[0];
    if (*(uint *)((long)(((RARegMask *)&pFVar27->field_0x18)->_masks)._data +
                 (long)pFVar42 * 4 + -0x18) == uVar39) {
      (pPVar33->dirty)._masks._data[0] = uVar46 & ~uVar29;
      pFVar27 = *(FuncNode **)&pFVar25->super_LabelNode;
      uStack_188 = 0x1236a9;
      uVar29 = (**(code **)(*(long *)&pFVar27->super_LabelNode + 0x60))(pFVar27,uVar41,uVar30);
      unaff_R15 = (FuncNode *)(ulong)uVar29;
      if (uVar29 == 0) goto LAB_001236b0;
      goto LAB_001236c3;
    }
  }
  uStack_188 = 0x12370d;
  spillScratchGpRegsBeforeEntry();
  uStack_188 = (ulong)uVar30;
  pFStack_190 = unaff_R15;
  pFStack_198 = pFVar25;
  uStack_1a0 = uVar41;
  uStack_1a8 = (ulong)uVar36;
  pFStack_1b0 = (FuncNode *)this;
  pFStack_3c8 = pFVar42;
  pFStack_400 = *(FuncNode **)((long)(((RARegMask *)&pFVar42->field_0x18)->_masks)._data + 8);
  ((*(BaseCompiler **)&pFVar27->field_0x8)->super_BaseBuilder)._cursor =
       (BaseNode *)*(PhysToWorkMap **)&pFVar42->super_LabelNode;
  *(FuncNode **)&pFVar27->field_0xe0 = pFVar42;
  *(FuncNode **)&pFVar27->field_0xe8 = pFStack_400;
  *(uint *)&pFVar27->field_0xf0 = (((RARegMask *)&pFStack_400->field_0x10)->_masks)._data[0];
  ((RARegCount *)&pFVar27->field_0xf4)->field_0 =
       (anon_union_4_2_ebeb14a8_for_RARegCount_0)
       (((RARegMask *)&pFStack_400->field_0x18)->_masks)._data[0];
  pFStack_448 = (FuncNode *)&pFVar27->field_0x48;
  ppuStack_3c0 = (uint **)((((RARegMask *)&pFVar42->field_0x38)->_masks)._data + 2);
  pFVar25 = (FuncNode *)0x0;
  uStack_408 = 0;
  pFStack_478 = pFVar27;
LAB_0012378e:
  pFVar34 = (FuncNode *)0x0;
  bVar21 = (char)pFVar25 * '\b';
  uStack_460 = *(FuncNode **)&pFVar27->field_0xe8;
  pFVar23 = (FuncNode *)0xff;
  uVar36 = (((RARegMask *)&uStack_460->field_0x10)->_masks)._data[1] >> (bVar21 & 0x1f) & 0xff;
  pFStack_458 = (FuncNode *)(ulong)uVar36;
  pFVar44 = (FuncNode *)(&uStack_460->field_0x48 + (ulong)(uVar36 << 5) + 4);
  uStack_464 = *(uint *)(&uStack_460->field_0x28 + (long)pFVar25 * 4 + 4);
  uStack_434 = *(uint *)(&uStack_460->field_0x38 + (long)pFVar25 * 4 + 4);
  uStack_414 = (((RARegCount *)&pFVar27->field_0xf4)->field_0)._packed >> (bVar21 & 0x1f) & 0xff;
  pFVar38 = (FuncNode *)(ulong)uStack_414;
  pFVar42 = pFVar44;
  pFStack_480 = pFVar25;
  pFStack_470 = pFVar44;
  if (uStack_414 != 0) {
    pFVar40 = (FuncNode *)(ulong)uStack_414;
    pFVar43 = (FuncNode *)0x0;
    pFVar26 = (FuncNode *)(ulong)uStack_414;
    uStack_420 = (FuncNode *)((ulong)uStack_420._4_4_ << 0x20);
    uVar30 = 0;
    pFVar49 = (FuncNode *)0x0;
    do {
      uVar29 = *(uint *)&pFVar42->field_0x8;
      pFVar48 = pFVar49;
      if ((uVar29 & 0x1c00) == 0) {
        pFVar19 = (FuncNode *)(ulong)uVar30;
LAB_00123857:
        if ((uVar29 & 0x40008) != 0) {
          pFVar48 = (FuncNode *)(ulong)((int)pFVar49 + 1);
          auStack_3b8[(long)pFVar49] = pFVar42;
        }
        if ((uVar29 >> 0x10 & 1) != 0) {
          uVar41 = (ulong)uStack_420 & 0xffffffff;
          pFVar23 = (FuncNode *)(ulong)((int)uStack_420 + 1U);
          uStack_420 = (FuncNode *)CONCAT44(uStack_420._4_4_,(int)uStack_420 + 1U);
          auStack_2b8[uVar41] = pFVar42;
        }
        iVar22 = (int)pFVar26;
        uVar30 = (uint)pFVar19;
        if ((uVar29 & 4) == 0) {
          *(uint *)&pFVar42->field_0x8 = uVar29 | 0x100;
          pFVar26 = (FuncNode *)(ulong)(iVar22 - 1);
          pFVar38 = (FuncNode *)0x6;
          goto LAB_001239a2;
        }
        pFVar38 = (FuncNode *)0x6;
        if ((uVar29 >> 10 & 1) != 0) goto LAB_001239a2;
        uVar39 = (((Layout *)&pFVar42->super_LabelNode)->physIndex).super_RARegCount.field_0._packed
        ;
        pFVar23 = (FuncNode *)0xffffffff;
        if ((ulong)uVar39 == 0xffffffff) goto LAB_00124d60;
        if ((((RAAssignment *)&pFVar27->field_0x48)->_layout).workCount <= uVar39)
        goto LAB_00124d65;
        bVar21 = ((RAAssignment *)&pFVar27->field_0x48)->_workToPhysMap[uVar39].physIds[0];
        bVar3 = *(byte *)((long)&pFVar42->field_0x8 + 6);
        pFVar23 = (FuncNode *)(ulong)bVar3;
        if (bVar3 == 0xff) {
          pFVar38 = (FuncNode *)0x0;
          if (bVar21 != 0xff) {
            uVar46 = 1 << (bVar21 & 0x1f);
            uVar39 = ~uStack_464 & *(uint *)&pFVar42->field_0x10;
            pFVar23 = (FuncNode *)(ulong)uVar39;
            if ((uVar39 >> (bVar21 & 0x1f) & 1) == 0) {
              pFVar43 = (FuncNode *)(ulong)((uint)pFVar43 | uVar46);
            }
            else {
              *(byte *)((long)&pFVar42->field_0x8 + 6) = bVar21;
              *(uint *)&pFVar42->field_0x8 = uVar29 | 0x100;
              if ((uVar29 & 2) != 0) {
                puVar35 = (((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap->dirty)._masks.
                          _data + (long)pFVar25;
                *puVar35 = *puVar35 | uVar46;
              }
              pFVar26 = (FuncNode *)(ulong)(iVar22 - 1);
              uStack_464 = uStack_464 | uVar46;
            }
            pFVar38 = (FuncNode *)0x0;
          }
          goto LAB_001239a2;
        }
        uVar39 = 1 << (bVar3 & 0x1f);
        pFVar38 = (FuncNode *)(ulong)uStack_464;
        pFVar49 = pFVar48;
        if ((uStack_464 >> (bVar3 & 0x1f) & 1) != 0) {
          if (bVar21 == bVar3) {
            *(uint *)&pFVar42->field_0x8 = uVar29 | 0x100;
            pFVar23 = (FuncNode *)(ulong)(uVar29 | 0x100);
            if ((uVar29 & 2) != 0) {
              puVar35 = (((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap->dirty)._masks._data
                        + (long)pFVar25;
              *puVar35 = *puVar35 | 1 << (bVar21 & 0x1f);
              pFVar23 = pFVar25;
            }
            pFVar26 = (FuncNode *)(ulong)(iVar22 - 1);
            uStack_464 = uStack_464 | uVar39;
          }
          else {
            pFVar43 = (FuncNode *)
                      (ulong)((uint)pFVar43 |
                             uVar39 & (((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap->
                                      assigned)._masks._data[(long)pFVar25]);
          }
          pFVar38 = (FuncNode *)0x0;
          goto LAB_001239a2;
        }
        goto LAB_00124d8d;
      }
      pFVar23 = (FuncNode *)(ulong)(uVar29 >> 0xd & 3);
      if ((uVar29 >> 0xc & 1) != 0) {
        pFVar23 = pFVar34;
      }
      uVar39 = 1 << (sbyte)pFVar23;
      if ((uVar30 >> (int)pFVar23 & 1) == 0) {
        *(FuncNode **)(auStack_3f8 + (long)pFVar23 * 8 + 0x10) = pFVar42;
        uVar46 = uVar39 | uVar30;
      }
      else {
        uStack_484 = 3;
        uVar46 = uVar30;
      }
      pFVar19 = (FuncNode *)(ulong)uVar46;
      if ((uVar39 & uVar30) == 0) goto LAB_00123857;
      pFVar38 = (FuncNode *)0x1;
      uVar30 = uVar46;
LAB_001239a2:
      if (((int)pFVar38 != 6) && ((int)pFVar38 != 0)) goto LAB_00124d0e;
      pFVar42 = (FuncNode *)((long)(((RARegMask *)&pFVar42->field_0x18)->_masks)._data + 8);
      pFVar40 = (FuncNode *)(&pFVar40[-1].field_0x250 + 0xff);
      pFVar49 = pFVar48;
      if (pFVar40 == (FuncNode *)0x0) goto LAB_001239ef;
    } while( true );
  }
  uVar30 = 0;
  uStack_420 = (FuncNode *)((ulong)uStack_420._4_4_ << 0x20);
  pFVar26 = (FuncNode *)0x0;
  pFVar43 = (FuncNode *)0x0;
  pFVar40 = uStack_460;
  pFVar49 = (FuncNode *)0x0;
LAB_001239ef:
  uVar8 = auStack_3f8._16_8_;
  pFStack_440 = (FuncNode *)((ulong)pFStack_440 & 0xffffffff00000000);
  uStack_44c = (uint)pFVar49;
  pFVar17 = pFVar43;
  if (uVar30 != 0) {
    pFVar38 = (FuncNode *)0x1;
    if ((uVar30 + 1 & uVar30) != 0) {
      uStack_484 = 3;
      goto LAB_00124d0e;
    }
    uVar29 = 0;
    if (~uVar30 != 0) {
      for (; (~uVar30 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
      }
    }
    pFStack_410 = (FuncNode *)(ulong)uVar29;
    pFVar40 = (FuncNode *)CONCAT71((int7)((ulong)pFVar40 >> 8),1);
    pFVar23 = pFStack_410;
    if ((*(byte *)(auStack_3f8._16_8_ + 9) & 4) == 0) goto LAB_00123c96;
    uVar30 = *(uint *)((long)(((RARegMask *)&pFVar27->field_0x18)->_masks)._data + (long)pFVar25 * 4
                      ) | (uint)pFVar43;
    pFVar40 = (FuncNode *)(ulong)uVar30;
    pFVar42 = (FuncNode *)(ulong)uVar29;
    if (uVar29 != 0) {
      uVar39 = (((RAAssignment *)&pFVar27->field_0x48)->_layout).workCount;
      pFVar23 = (FuncNode *)(ulong)uVar39;
      pFVar19 = (FuncNode *)((RAAssignment *)&pFVar27->field_0x48)->_workToPhysMap;
      lVar16 = 0;
      while( true ) {
        uVar46 = **(uint **)(auStack_3f8 + lVar16 * 8 + 0x10);
        pFVar48 = pFVar49;
        if ((ulong)uVar46 == 0xffffffff) goto LAB_00124d6a;
        pFVar24 = pFVar23;
        pFVar32 = pFVar26;
        if (uVar39 <= uVar46) break;
        *(uint *)(auStack_3f8 + lVar16 * 4) =
             (uint)*(byte *)((long)(((RARegMask *)&pFVar19->field_0x18)->_masks)._data +
                            ((ulong)uVar46 - 0x18));
        lVar16 = lVar16 + 1;
        if (pFVar42 == (FuncNode *)lVar16) goto LAB_00123aa3;
      }
      goto LAB_00124d6f;
    }
LAB_00123aa3:
    uStack_450 = (uint)pFVar26;
    uVar39 = *(uint *)(uVar8 + 0x10);
    if (uVar39 == 0) {
      pFVar17 = (FuncNode *)0xffffffff;
    }
    else {
      uVar30 = uVar30 & ~uStack_464;
      pFVar40 = (FuncNode *)(ulong)uVar30;
      pLVar11 = (Layout *)&pFVar27->super_LabelNode;
      pFVar17 = (FuncNode *)0xffffffff;
      pFVar45 = (FuncNode *)0x0;
      pFStack_430 = (FuncNode *)CONCAT44(pFStack_430._4_4_,uVar39);
      uVar46 = uVar39;
      do {
        pFVar32 = (FuncNode *)(ulong)uVar46;
        uVar47 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
          }
        }
        pFVar34 = (FuncNode *)(ulong)uVar47;
        if ((uVar39 >> (uVar47 & 0x1f) & 1) != 0) {
          if (uVar29 == 0) {
            pFVar48 = (FuncNode *)0xf;
          }
          else {
            pFVar24 = (FuncNode *)(ulong)uVar47;
            pFVar48 = (FuncNode *)0xf;
            pFVar27 = (FuncNode *)0x0;
            pFVar52 = (FuncNode *)0x1;
            do {
              uVar47 = 1 << ((byte)pFVar24 & 0x1f) & uVar30;
              pFVar23 = (FuncNode *)(ulong)uVar47;
              if (uVar47 == 0) {
                pFVar48 = (FuncNode *)0x0;
              }
              else {
                if (*(uint *)(*(long *)pLVar11 + 0x148) <=
                    **(uint **)(auStack_3f8 + (long)pFVar27 * 2 + 0x10)) {
                  pcStack_490 = (code *)0x124d47;
                  allocInst();
                  goto LAB_00124d47;
                }
                pFVar38 = (FuncNode *)
                          (ulong)(pFVar24 ==
                                 (FuncNode *)(ulong)*(uint *)(auStack_3f8 + (long)pFVar27));
                pFVar48 = (FuncNode *)
                          (ulong)((int)pFVar48 +
                                  (uint)(pFVar24 ==
                                        (FuncNode *)
                                        (ulong)*(byte *)(*(long *)(*(long *)(*(long *)pLVar11 +
                                                                            0x140) +
                                                                  (ulong)**(uint **)(auStack_3f8 +
                                                                                    (long)pFVar27 *
                                                                                    2 + 0x10) * 8) +
                                                        0x4a)) +
                                 (uint)(pFVar24 ==
                                       (FuncNode *)(ulong)*(uint *)(auStack_3f8 + (long)pFVar27)) *
                                 2);
              }
              unaff_R15 = pFVar52;
              if (uVar47 == 0) break;
              pFVar27 = (FuncNode *)&pFVar27->field_0x4;
              pFVar24 = (FuncNode *)&pFVar24->field_0x1;
              unaff_R15 = (FuncNode *)&pFVar52->field_0x1;
              bVar55 = pFVar52 < pFVar42;
              pFVar52 = unaff_R15;
            } while (bVar55);
          }
          pFVar19 = pFVar43;
          pFVar27 = pFStack_478;
          if ((uint)pFVar45 < (uint)pFVar48) {
            pFVar17 = pFVar34;
            pFVar45 = pFVar48;
          }
        }
        uVar46 = uVar46 - 1 & uVar46;
        pFVar23 = (FuncNode *)(ulong)uVar46;
      } while (uVar46 != 0);
    }
    bVar55 = (int)pFVar17 == -1;
    pFVar40 = (FuncNode *)CONCAT71((int7)((ulong)pFVar40 >> 8),!bVar55);
    if (bVar55) {
      uStack_484 = 0x3d;
LAB_00123c96:
      pFVar38 = (FuncNode *)0x1;
      pFVar17 = pFVar43;
      if ((char)pFVar40 == '\0') goto LAB_00124d0e;
      goto LAB_00123c9f;
    }
    pFVar34 = (FuncNode *)0x0;
    pFVar23 = pFStack_410;
    if (uVar29 == 0) goto LAB_00123c96;
    pFVar42 = (FuncNode *)(ulong)(uVar29 * 8);
    pFVar19 = (FuncNode *)0x0;
    while( true ) {
      pFVar38 = (FuncNode *)0x1;
      uVar30 = 1 << ((byte)pFVar17 & 0x1f);
      puVar35 = *(uint **)((long)&pFVar19->field_0x10 + (long)auStack_3f8);
      pFVar23 = (FuncNode *)(ulong)*puVar35;
      if (pFVar23 == (FuncNode *)0xffffffff) goto LAB_00124d92;
      if ((((RAAssignment *)&pFVar27->field_0x48)->_layout).workCount <= *puVar35) break;
      bVar21 = (((RAAssignment *)&pFVar27->field_0x48)->_workToPhysMap + -0x18)
               [(long)&((RARegMask *)&pFVar23->field_0x18)->_masks].physIds[0];
      pFVar23 = (FuncNode *)(ulong)bVar21;
      *(byte *)((long)puVar35 + 0xe) = (byte)pFVar17;
      if ((uint)pFVar17 == (uint)bVar21) {
        uVar29 = puVar35[2];
        puVar35[2] = uVar29 | 0x100;
        if ((uVar29 & 2) != 0) {
          pFVar23 = (FuncNode *)((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap;
          puVar35 = (uint *)((long)(((RARegMask *)&pFVar23->field_0x18)->_masks)._data +
                            (long)pFVar25 * 4 + -8);
          *puVar35 = *puVar35 | 1 << (bVar21 & 0x1f);
        }
        pFVar26 = (FuncNode *)(ulong)((int)pFVar26 - 1);
      }
      else {
        uVar29 = (((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap->assigned)._masks._data
                 [(long)pFVar25] & uVar30;
        pFVar23 = (FuncNode *)(ulong)uVar29;
        pFVar43 = (FuncNode *)(ulong)((uint)pFVar43 | uVar29);
      }
      uStack_464 = uStack_464 | uVar30;
      pFVar19 = (FuncNode *)&pFVar19->field_0x8;
      pFVar17 = (FuncNode *)(ulong)((uint)pFVar17 + 1);
      if (pFVar42 == pFVar19) goto LAB_00123c96;
    }
    goto LAB_00124d97;
  }
  pFStack_410 = (FuncNode *)0x0;
LAB_00123c9f:
  pFVar24 = pFVar23;
  pFVar32 = pFVar26;
  pFVar23 = pFVar17;
  if ((uint)pFVar26 != 0) {
    pFVar38 = (FuncNode *)0x0;
    pFVar23 = (FuncNode *)(ulong)uStack_414;
    if (uStack_414 == 0) {
LAB_001240f6:
      pFStack_440 = (FuncNode *)CONCAT44(pFStack_440._4_4_,(int)pFVar26);
      pFVar24 = pFVar23;
      pFVar32 = pFVar26;
      pFVar23 = pFVar17;
      if ((int)pFVar38 != 0) goto LAB_00124d0e;
      goto LAB_00124102;
    }
    pFVar34 = (FuncNode *)
              (ulong)(~(uint)pFVar17 &
                     (((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap->assigned)._masks._data
                     [(long)pFVar25]);
    pFVar40 = (FuncNode *)(&uStack_460->field_0x48 + (ulong)(uVar36 << 5) + 0x1c);
    pFVar19 = (FuncNode *)(ulong)(uStack_414 << 5);
    pFVar32 = (FuncNode *)0x0;
    uStack_450 = (uint)pFVar26;
    pFStack_440 = pFVar40;
    pFStack_430 = pFVar19;
    while( true ) {
      pFVar38 = (FuncNode *)0x0;
      uVar36 = *(uint *)((long)(&pFVar40[-1].field_0x250 + 0xf0) + (long)pFVar32);
      pFVar49 = (FuncNode *)0x16;
      if ((uVar36 >> 8 & 1) != 0) goto LAB_00124087;
      uVar30 = *(uint *)((long)(&pFVar40[-1].field_0x250 + 0xe8) + (long)pFVar32);
      unaff_R15 = (FuncNode *)(ulong)uVar30;
      pFVar24 = (FuncNode *)0xffffffff;
      if (unaff_R15 == (FuncNode *)0xffffffff) goto LAB_00124d74;
      pFVar43 = pFVar17;
      if ((((RAAssignment *)&pFVar27->field_0x48)->_layout).workCount <= uVar30) goto LAB_00124d79;
      pFVar23 = (FuncNode *)((RAAssignment *)&pFVar27->field_0x48)->_workToPhysMap;
      bVar21 = *(byte *)((long)(((RARegMask *)&unaff_R15->field_0x18)->_masks)._data +
                        (long)&pFVar23[-1]._exitNode);
      uVar29 = (uint)bVar21;
      pFVar43 = pFVar27;
      if ((((uStack_408 & 1) == 0) && ((uVar36 & 0x10) != 0)) && (bVar21 == 0xff)) break;
LAB_00123d37:
      uVar36 = uStack_464;
      pFVar49 = (FuncNode *)0x0;
      pFVar27 = pFVar43;
      if ((&pFVar40[-1].field_0x250 + 0xf6)[(long)pFVar32] == -1) {
        pFStack_458 = (FuncNode *)CONCAT44(pFStack_458._4_4_,(int)pFVar34);
        uStack_428 = (uint32_t *)(CONCAT44(uStack_428._4_4_,(int)pFVar25) & 0xffffffff000000ff);
        uStack_460 = (FuncNode *)CONCAT44(uStack_460._4_4_,uVar29);
        pcStack_490 = (code *)0x123d76;
        uVar14 = decideOnAssignment((RALocalAllocator *)pFVar43,(RegGroup)pFVar25,uVar30,
                                    (uint32_t)pFVar23,
                                    ~(uStack_464 | (uint)pFVar17) &
                                    *(uint *)((long)(&pFVar40[-1].field_0x250 + 0xf8) +
                                             (long)pFVar32));
        pFVar42 = (FuncNode *)((ulong)uStack_460 & 0xffffffff);
        pFVar23 = (FuncNode *)(ulong)uVar14;
        uVar29 = 1 << ((byte)uVar14 & 0x1f);
        uStack_464 = uVar36 | 1 << (uVar14 & 0x1f);
        uVar36 = (uint)pFStack_458;
        pFVar34 = (FuncNode *)((ulong)pFStack_458 & 0xffffffff);
        uVar39 = (uint)pFVar17 | uVar29 & (uint)pFStack_458;
        pFVar17 = (FuncNode *)(ulong)uVar39;
        (&pFStack_440[-1].field_0x250 + 0xf6)[(long)pFVar32] = (byte)uVar14;
        if ((uint)uStack_460 == 0xff) {
          if ((uVar29 & (uint)pFStack_458) == 0) {
            pFVar42 = (FuncNode *)0x0;
            pcStack_490 = (code *)0x124005;
            uStack_438 = uVar29;
            RAAssignment::assign
                      ((RAAssignment *)pFStack_448,(RegGroup)uStack_428,uVar30,uVar14,false);
            pcStack_490 = (code *)0x124019;
            uVar30 = (**(code **)(*(long *)((*(PhysToWorkMap **)&pFStack_478->super_LabelNode)->
                                           assigned)._masks._data + 0x58))
                               (*(PhysToWorkMap **)&pFStack_478->super_LabelNode,unaff_R15,uVar14);
            if (uVar30 != 0) {
              uStack_484 = uVar30;
            }
            pFVar23 = (FuncNode *)(ulong)uStack_484;
            if (uVar30 != 0) {
              pFVar49 = (FuncNode *)0x1;
              pFVar25 = pFStack_480;
              pFVar40 = pFStack_440;
              pFVar19 = pFStack_430;
              pFVar44 = pFStack_470;
              pFVar27 = pFStack_478;
              goto LAB_00124087;
            }
            uVar30 = *(uint *)((long)(&pFStack_440[-1].field_0x250 + 0xf0) + (long)pFVar32);
            uVar29 = uVar30 | 0x100;
            pFVar23 = (FuncNode *)(ulong)uVar29;
            *(uint *)((long)(&pFStack_440[-1].field_0x250 + 0xf0) + (long)pFVar32) = uVar29;
            if ((uVar30 & 2) != 0) {
              puVar35 = (((RAAssignment *)&pFStack_478->field_0x48)->_physToWorkMap->dirty)._masks.
                        _data + (long)pFStack_480;
              *puVar35 = *puVar35 | uStack_438;
            }
            uStack_450 = uStack_450 - 1;
            uVar29 = uStack_438;
          }
        }
        else {
          uVar36 = (uint)pFStack_458 & ~(1 << ((uint)uStack_460 & 0x1f));
          pFVar34 = (FuncNode *)(ulong)uVar36;
          bVar55 = true;
          if ((uVar29 & uVar36) == 0) {
            uVar46 = 0;
            if (uVar14 != (uint)uStack_460) {
              pcStack_490 = (code *)0x123f93;
              uStack_438 = uVar29;
              RAAssignment::reassign
                        ((RAAssignment *)pFStack_448,(RegGroup)uStack_428,uVar30,uVar14,
                         (uint)uStack_460);
              pcStack_490 = (code *)0x123fab;
              uVar46 = (**(code **)(*(long *)((*(PhysToWorkMap **)&pFStack_478->super_LabelNode)->
                                             assigned)._masks._data + 0x48))
                                 (*(PhysToWorkMap **)&pFStack_478->super_LabelNode,unaff_R15,uVar14,
                                  (ulong)uStack_460 & 0xffffffff);
              pFVar42 = (FuncNode *)((ulong)uStack_460 & 0xffffffff);
              uVar29 = uStack_438;
            }
            if (uVar46 != 0) {
              uStack_484 = uVar46;
            }
            pFVar23 = (FuncNode *)(ulong)uStack_484;
            if (uVar46 == 0) {
              uVar30 = *(uint *)((long)(&pFStack_440[-1].field_0x250 + 0xf0) + (long)pFVar32);
              uVar46 = uVar30 | 0x100;
              pFVar23 = (FuncNode *)(ulong)uVar46;
              *(uint *)((long)(&pFStack_440[-1].field_0x250 + 0xf0) + (long)pFVar32) = uVar46;
              if ((uVar30 & 2) != 0) {
                puVar35 = (((RAAssignment *)&pFStack_478->field_0x48)->_physToWorkMap->dirty)._masks
                          ._data + (long)pFStack_480;
                *puVar35 = *puVar35 | uVar29;
              }
              uStack_450 = uStack_450 - 1;
              bVar55 = true;
            }
            else {
              bVar55 = false;
            }
          }
          pFVar17 = (FuncNode *)(ulong)(uVar39 | 1 << ((uint)pFVar42 & 0x1f));
          if (!bVar55) {
            pFVar49 = (FuncNode *)0x1;
            pFVar25 = pFStack_480;
            pFVar40 = pFStack_440;
            pFVar19 = pFStack_430;
            pFVar44 = pFStack_470;
            pFVar27 = pFStack_478;
            goto LAB_00124087;
          }
        }
        pFVar34 = (FuncNode *)(ulong)(uVar36 | uVar29);
        pFVar25 = pFStack_480;
        pFVar40 = pFStack_440;
        pFVar19 = pFStack_430;
        pFVar44 = pFStack_470;
        pFVar27 = pFStack_478;
      }
LAB_00124087:
      if ((((int)pFVar49 != 0x16) && (pFVar38 = pFVar49, (int)pFVar49 != 0)) ||
         (pFVar32 = (FuncNode *)((long)(((RARegMask *)&pFVar32->field_0x18)->_masks)._data + 8),
         pFVar38 = (FuncNode *)0x0, pFVar19 == pFVar32)) {
        pFVar26 = (FuncNode *)(ulong)uStack_450;
        goto LAB_001240f6;
      }
    }
    uVar36 = *(uint *)((long)(((RARegMask *)&pFVar32->field_0x18)->_masks)._data +
                      (long)&pFVar40[-1]._exitNode);
    pFVar27 = (FuncNode *)(ulong)uVar36;
    uVar39 = uVar36 ^ uVar36 - 1;
    pFVar23 = (FuncNode *)(ulong)uVar39;
    pFVar43 = pFStack_478;
    if (uVar39 <= uVar36 - 1) goto LAB_00123d37;
    pFVar43 = *(FuncNode **)&pFStack_478->super_LabelNode;
    pFStack_458 = pFVar17;
    if (uVar30 < *(uint *)(&pFVar43->field_0x100 + 0x48)) {
      uStack_428 = *(uint32_t **)(*(long *)(&pFVar43->field_0x100 + 0x40) + (long)unaff_R15 * 8);
      bVar3 = (&pFVar40[-1].field_0x250 + 0xf5)[(long)pFVar32];
      pFVar42 = (FuncNode *)(ulong)bVar3;
      uVar39 = *(uint *)(*(long *)(uStack_428 + 2) + 8);
      pFVar49 = (FuncNode *)0x0;
      uVar29 = (uint)bVar21;
      if (bVar3 <= uVar39) {
        uStack_438 = uVar39;
        uVar29 = (uint)bVar21;
        if (*(long *)(uStack_428 + 6) == 0) {
          uStack_408 = CONCAT44(uStack_408._4_4_,(uint)bVar3);
          uStack_460 = (FuncNode *)CONCAT44(uStack_460._4_4_,0xff);
          pcStack_490 = (code *)0x123e8f;
          pRVar18 = RAStackAllocator::newSlot
                              ((RAStackAllocator *)(&pFVar43->field_0x100 + 0xf8),
                               *(uint32_t *)(&pFVar43->field_0x100 + 0xdc),uVar39,
                               (uint)*(byte *)(*(long *)(uStack_428 + 2) + 0xc),1);
          pFVar42 = (FuncNode *)(uStack_408 & 0xffffffff);
          uVar29 = (uint)uStack_460;
          *(RAStackSlot **)(uStack_428 + 6) = pRVar18;
          *(byte *)((long)uStack_428 + 0x25) = *(byte *)((long)uStack_428 + 0x25) | 1;
          pFVar40 = pFStack_440;
          pFVar44 = pFStack_470;
        }
        uVar39 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
          }
        }
        piVar2 = (int *)((long)ppuStack_3c0 + (ulong)(uVar39 & 0xfffffffc) * 4);
        uVar36 = *(uint *)(&pFVar43->field_0x100 + 0xd8);
        piVar2[1] = uStack_428[1];
        piVar2[2] = 0;
        piVar2[3] = 0;
        *piVar2 = (uVar36 & 0xf8) + (int)pFVar42 * 0x1000000 + 0x2002;
        *(undefined4 *)
         ((long)(((RARegMask *)&pFVar32->field_0x18)->_masks)._data + (long)&pFVar40[-1]._exitNode)
             = 0;
        (&pFVar40[-1].field_0x250 + 0xf1)[(long)pFVar32] =
             (&pFVar40[-1].field_0x250 + 0xf1)[(long)pFVar32] | 1;
        pbVar1 = (byte *)((long)&pFStack_400->field_0x8 + 7);
        *pbVar1 = *pbVar1 | 0x40;
        uStack_450 = uStack_450 - 1;
        uStack_408 = CONCAT71((int7)((ulong)pFStack_400 >> 8),1);
        pFVar49 = (FuncNode *)0x16;
        pFVar25 = pFStack_480;
        uVar39 = uStack_438;
      }
      pFVar23 = (FuncNode *)(ulong)uVar39;
      pFVar27 = pFStack_478;
      pFVar43 = pFStack_478;
      pFVar17 = pFStack_458;
      if ((uint)pFVar42 <= uVar39) goto LAB_00124087;
      goto LAB_00123d37;
    }
    goto LAB_00124da1;
  }
LAB_00124102:
  if ((uint)pFVar23 != 0) {
    uStack_460 = (FuncNode *)
                 CONCAT44(uStack_460._4_4_,
                          ~(uStack_464 | (uint)pFVar23 |
                           (((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap->assigned)._masks
                           ._data[(long)pFVar25] | uStack_434) &
                          *(uint *)((long)(((RARegMask *)&pFVar27->field_0x18)->_masks)._data +
                                   (long)pFVar25 * 4));
    do {
      pFVar32 = pFVar23;
      uVar36 = 0;
      uVar30 = (uint)pFVar32;
      if (uVar30 != 0) {
        for (; (uVar30 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
        }
      }
      unaff_R15 = (FuncNode *)(ulong)uVar36;
      pFVar24 = unaff_R15;
      if ((*(uint *)(*(long *)(&pFVar27->field_0x48 + 0x20) + (long)pFVar25 * 4) >> (uVar36 & 0x1f)
          & 1) == 0) {
        pFVar38 = (FuncNode *)0x0;
        pFVar23 = pFVar32;
      }
      else {
        uVar29 = *(uint *)(*(long *)(&pFVar27->field_0x48 + (long)pFVar25 * 8 + 0x28) +
                          (long)unaff_R15 * 4);
        pFVar23 = (FuncNode *)(ulong)uVar29;
        pFVar42 = (FuncNode *)((ulong)uStack_460 & 0xffffffff);
        if ((uint)uStack_460 == 0) {
          uStack_460 = (FuncNode *)((ulong)uStack_460 & 0xffffffff00000000);
        }
        else {
          pcStack_490 = (code *)0x12417a;
          pFVar19 = pFStack_400;
          uVar14 = decideOnReassignment
                             ((RALocalAllocator *)pFVar27,(RegGroup)pFVar25,uVar29,uVar36,
                              (uint)uStack_460,(RAInst *)pFStack_400);
          pFVar38 = (FuncNode *)0x0;
          if (uVar14 != 0xff) {
            uVar39 = 0;
            if (uVar14 != uVar36) {
              pFVar42 = (FuncNode *)(ulong)uVar36;
              pcStack_490 = (code *)0x1241c7;
              RAAssignment::reassign
                        ((RAAssignment *)pFStack_448,(RegGroup)pFVar25,uVar29,uVar14,uVar36);
              pFVar27 = *(FuncNode **)&pFStack_478->super_LabelNode;
              pcStack_490 = (code *)0x1241de;
              uVar39 = (**(code **)(*(long *)(((RARegMask *)&pFVar27->super_LabelNode)->_masks).
                                             _data + 0x48))(pFVar27,pFVar23,uVar14,uVar36);
            }
            pFVar38 = (FuncNode *)0x1;
            if (uVar39 != 0) {
              uStack_484 = uVar39;
            }
            pFVar24 = (FuncNode *)(ulong)uStack_484;
            if (uVar39 == 0) {
              uStack_460 = (FuncNode *)
                           CONCAT44(uStack_460._4_4_,(uint)uStack_460 ^ 1 << (uVar14 & 0x1f));
              puVar35 = (uint *)((long)((Array<unsigned_int_*,_4UL> *)&pFStack_478->field_0x28)->
                                       _data + (long)pFStack_480 * 4);
              *puVar35 = *puVar35 | 1 << ((byte)uVar14 & 0x1f);
              pFVar38 = (FuncNode *)0x1c;
              pFVar24 = pFStack_478;
            }
          }
          pFVar25 = pFStack_480;
          pFVar40 = pFVar27;
          pFVar44 = pFStack_470;
          pFVar27 = pFStack_478;
          if (uVar14 != 0xff) goto LAB_00124291;
        }
        if ((*(uint *)(*(long *)(&pFVar27->field_0x48 + 0x20) + 0x10 + (long)pFVar25 * 4) &
            1 << ((byte)uVar36 & 0x1f)) == 0) {
LAB_0012425f:
          pcStack_490 = (code *)0x124272;
          pFVar40 = pFStack_448;
          RAAssignment::unassign((RAAssignment *)pFStack_448,(RegGroup)pFVar25,uVar29,uVar36);
          uVar39 = 0;
        }
        else {
          pcStack_490 = (code *)0x124256;
          pFVar40 = pFVar27;
          uVar39 = onSaveReg((RALocalAllocator *)pFVar27,(RegGroup)pFVar25,uVar29,uVar36);
          pFVar25 = pFStack_480;
          if (uVar39 == 0) goto LAB_0012425f;
        }
        pFVar38 = (FuncNode *)(ulong)(uVar39 != 0);
        if (uVar39 != 0) {
          uStack_484 = uVar39;
        }
        pFVar24 = (FuncNode *)(ulong)uStack_484;
        pFVar25 = pFStack_480;
        pFVar44 = pFStack_470;
      }
LAB_00124291:
      if (((int)pFVar38 != 0x1c) && ((int)pFVar38 != 0)) goto LAB_001242af;
      uVar30 = uVar30 - 1 & uVar30;
      pFVar23 = (FuncNode *)(ulong)uVar30;
    } while (uVar30 != 0);
    pFVar38 = (FuncNode *)0x0;
LAB_001242af:
    if ((int)pFVar38 != 0) goto LAB_00124d0e;
  }
  if ((int)pFStack_440 != 0) {
    uStack_460 = (FuncNode *)(ulong)uStack_414;
    pFStack_430 = (FuncNode *)((ulong)pFStack_430 & 0xffffffff00000000);
    pFVar43 = pFVar19;
    pFVar52 = unaff_R15;
    do {
      if (uStack_414 == 0) {
        pFVar19 = (FuncNode *)((ulong)pFStack_440 & 0xffffffff);
        pFStack_458 = pFVar19;
      }
      else {
        pFVar48 = (FuncNode *)0x0;
        pFVar19 = (FuncNode *)((ulong)pFStack_440 & 0xffffffff);
        pFStack_458 = pFVar19;
        do {
          pFVar38 = (FuncNode *)0x25;
          if (((ulong)*(WorkToPhysMap **)
                       ((RARegMask *)&pFVar44->field_0x18)[(long)pFVar48 * 2 + -1]._masks._data &
              0x100) == 0) {
            pFVar34 = (FuncNode *)
                      ((long)((RARegMask *)&pFVar44->field_0x18)[(long)pFVar48 * 2 + -2]._masks.
                             _data + 8);
            uVar36 = (((Layout *)&pFVar34->super_LabelNode)->physIndex).super_RARegCount.field_0.
                     _packed;
            pFVar32 = (FuncNode *)(ulong)uVar36;
            if (pFVar32 == (FuncNode *)0xffffffff) goto LAB_00124d47;
            if ((((RAAssignment *)&pFVar27->field_0x48)->_layout).workCount <= uVar36)
            goto LAB_00124d4c;
            bVar21 = (((RAAssignment *)&pFVar27->field_0x48)->_workToPhysMap + -0x18)
                     [(long)&((RARegMask *)&pFVar32->field_0x18)->_masks].physIds[0];
            pFVar52 = (FuncNode *)(ulong)bVar21;
            bVar3 = *(byte *)((long)((Array<unsigned_int_*,_4UL> *)&pFVar34->field_0x8)->_data + 6);
            pFVar23 = (FuncNode *)(ulong)bVar3;
            if (bVar3 == bVar21) goto LAB_00124d51;
            pFVar44 = pFVar27;
            pFVar49 = pFVar23;
            if (0x1f < bVar3) goto LAB_00124d56;
            uVar29 = (uint)bVar3;
            uVar30 = (((RAAssignment *)&pFVar27->field_0x48)->_physToWorkIds)._data[(long)pFVar25]
                     [(long)pFVar23];
            pFVar44 = (FuncNode *)(ulong)uVar30;
            uVar39 = (uint)bVar3;
            uVar46 = (uint)bVar21;
            if (pFVar44 != (FuncNode *)0xffffffff) {
              pFVar19 = *(FuncNode **)&pFVar27->super_LabelNode;
              if (*(uint *)(&pFVar19->field_0x100 + 0x48) <= uVar30) goto LAB_00124d5b;
              RVar13 = (RegGroup)pFStack_480;
              pFVar24 = pFVar23;
              if ((uVar46 == 0xff) ||
                 (bVar4 = *(byte *)((long)(((RARegMask *)&pFStack_480->field_0x18)->_masks)._data +
                                   *(long *)&pFStack_478->field_0x10 + -8),
                 pFVar24 = (FuncNode *)
                           (CONCAT71((int7)((ulong)*(long *)&pFStack_478->field_0x10 >> 8),bVar4) &
                           0xffffffffffffff01), (bVar4 & 1) == 0)) {
                if (((ulong)pFStack_430 & 1) != 0) {
                  uVar29 = ~*(uint *)(*(long *)(&pFStack_478->field_0x48 + 0x20) +
                                     (long)pFStack_480 * 4) &
                           *(uint *)(&pFStack_478->field_0x18 + (long)pFStack_480 * 4);
                  if (uVar29 == 0) {
                    if ((*(uint *)(*(long *)(&pFStack_478->field_0x48 + 0x20) + 0x10 +
                                  (long)pFStack_480 * 4) >> (uVar39 & 0x1f) & 1) == 0) {
LAB_0012457b:
                      pcStack_490 = (code *)0x12458e;
                      pFVar40 = pFStack_448;
                      RAAssignment::unassign
                                ((RAAssignment *)pFStack_448,(RegGroup)pFStack_480,uVar30,uVar39);
                      pFVar19 = (FuncNode *)0x0;
                    }
                    else {
                      pcStack_490 = (code *)0x124572;
                      pFVar40 = pFStack_478;
                      EVar15 = onSaveReg((RALocalAllocator *)pFStack_478,RVar13,uVar30,uVar39);
                      pFVar19 = (FuncNode *)(ulong)EVar15;
                      if (EVar15 == 0) goto LAB_0012457b;
                    }
                    bVar55 = (int)pFVar19 != 0;
                    pFVar38 = (FuncNode *)(ulong)bVar55;
                    pFVar24 = (FuncNode *)(ulong)uStack_484;
                    if (bVar55) {
                      pFVar24 = pFVar19;
                    }
                    uStack_484 = (uint)pFVar24;
                  }
                  else {
                    uVar30 = ~*(uint *)(&pFStack_478->field_0x38 + (long)pFStack_480 * 4) & uVar29;
                    if (uVar30 == 0) {
                      uVar30 = uVar29;
                    }
                    uVar29 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    pFVar19 = (FuncNode *)0x0;
                    if (uVar29 != uVar46) {
                      pFVar42 = (FuncNode *)(ulong)uVar46;
                      pcStack_490 = (code *)0x124457;
                      RAAssignment::reassign
                                ((RAAssignment *)pFStack_448,RVar13,uVar36,uVar29,uVar46);
                      pFVar40 = *(FuncNode **)&pFStack_478->super_LabelNode;
                      pcStack_490 = (code *)0x12446d;
                      pFVar19 = (FuncNode *)
                                (**(code **)(*(long *)(((RARegMask *)&pFVar40->super_LabelNode)->
                                                      _masks)._data + 0x48))
                                          (pFVar40,pFVar32,uVar29,bVar21);
                    }
                    pFVar38 = (FuncNode *)0x1;
                    bVar55 = (int)pFVar19 != 0;
                    pFVar24 = (FuncNode *)(ulong)uStack_484;
                    if (bVar55) {
                      pFVar24 = (FuncNode *)((ulong)pFVar19 & 0xffffffff);
                    }
                    uStack_484 = (uint)pFVar24;
                    if (!bVar55) {
                      pFVar24 = (FuncNode *)(ulong)uVar29;
                      uVar30 = 1 << ((byte)uVar29 & 0x1f);
                      pFVar19 = (FuncNode *)(ulong)uVar30;
                      puVar35 = (uint *)((long)((Array<unsigned_int_*,_4UL> *)
                                               &pFStack_478->field_0x28)->_data +
                                        (long)pFStack_480 * 4);
                      *puVar35 = *puVar35 | uVar30;
                      pFVar38 = (FuncNode *)0x23;
                    }
                  }
                }
              }
              else {
                uStack_428 = *(uint32_t **)
                              (*(long *)(&pFVar19->field_0x100 + 0x40) + (long)pFVar44 * 8);
                pFVar43 = (FuncNode *)(ulong)uVar29;
                pcStack_490 = (code *)0x1243bc;
                RAAssignment::swap((RAAssignment *)pFStack_448,RVar13,uVar36,uVar46,uVar30,uVar29);
                pFVar40 = *(FuncNode **)&pFStack_478->super_LabelNode;
                pFVar42 = (FuncNode *)(ulong)uVar29;
                pcStack_490 = (code *)0x1243d5;
                pFVar19 = (FuncNode *)
                          (**(code **)(*(long *)(((RARegMask *)&pFVar40->super_LabelNode)->_masks).
                                                _data + 0x50))(pFVar40,pFVar32,uVar46,pFVar44);
                pFVar38 = (FuncNode *)0x1;
                bVar55 = (int)pFVar19 != 0;
                pFVar24 = (FuncNode *)(ulong)uStack_484;
                if (bVar55) {
                  pFVar24 = (FuncNode *)((ulong)pFVar19 & 0xffffffff);
                }
                uStack_484 = (uint)pFVar24;
                if (!bVar55) {
                  uVar30 = *(uint *)((Array<unsigned_int_*,_4UL> *)&pFVar34->field_0x8)->_data;
                  *(uint *)((Array<unsigned_int_*,_4UL> *)&pFVar34->field_0x8)->_data =
                       uVar30 | 0x100;
                  if ((uVar30 & 2) != 0) {
                    puVar35 = (((RAAssignment *)&pFStack_478->field_0x48)->_physToWorkMap->dirty).
                              _masks._data + (long)pFStack_480;
                    *puVar35 = *puVar35 | 1 << (bVar3 & 0x1f);
                  }
                  iVar22 = (int)pFStack_458;
                  pFVar19 = (FuncNode *)(ulong)(iVar22 - 1);
                  pFVar24 = pFStack_470;
                  pFVar27 = uStack_460;
                  do {
                    if ((((Layout *)&pFVar24->super_LabelNode)->physIndex).super_RARegCount.field_0.
                        _packed == *uStack_428) goto LAB_00124501;
                    pFVar24 = (FuncNode *)
                              ((long)(((RARegMask *)&pFVar24->field_0x18)->_masks)._data + 8);
                    pFVar27 = (FuncNode *)(&pFVar27[-1].field_0x250 + 0xff);
                  } while (pFVar27 != (FuncNode *)0x0);
                  pFVar24 = (FuncNode *)0x0;
LAB_00124501:
                  pFVar38 = (FuncNode *)0x25;
                  pFStack_458 = pFVar19;
                  if ((pFVar24 != (FuncNode *)0x0) &&
                     (*(byte *)((long)&pFVar24->field_0x8 + 6) == bVar21)) {
                    uVar30 = *(uint *)&pFVar24->field_0x8;
                    *(uint *)&pFVar24->field_0x8 = uVar30 | 0x100;
                    if ((uVar30 & 2) != 0) {
                      pFVar24 = (FuncNode *)
                                ((RAAssignment *)&pFStack_478->field_0x48)->_physToWorkMap;
                      puVar35 = (uint *)((long)(((RARegMask *)&pFVar24->field_0x18)->_masks)._data +
                                        (long)pFStack_480 * 4 + -8);
                      *puVar35 = *puVar35 | 1 << (bVar21 & 0x1f);
                    }
                    pFVar19 = (FuncNode *)(ulong)(iVar22 - 2);
                    pFStack_458 = pFVar19;
                  }
                }
              }
              pFVar25 = pFStack_480;
              pFVar44 = pFStack_470;
              pFVar27 = pFStack_478;
              if ((int)pFVar38 != 0) goto LAB_0012466a;
            }
            if (bVar21 == 0xff) {
              pFVar42 = (FuncNode *)0x0;
              pcStack_490 = (code *)0x1245fe;
              RAAssignment::assign
                        ((RAAssignment *)pFStack_448,(RegGroup)pFStack_480,uVar36,uVar39,false);
              pFVar40 = *(FuncNode **)&pFVar27->super_LabelNode;
              pcStack_490 = (code *)0x12460d;
              pFVar19 = (FuncNode *)
                        (**(code **)(*(long *)(((RARegMask *)&pFVar40->super_LabelNode)->_masks).
                                              _data + 0x58))(pFVar40,pFVar32,uVar39);
            }
            else {
              pFVar42 = (FuncNode *)(ulong)uVar46;
              pcStack_490 = (code *)0x1245d8;
              RAAssignment::reassign
                        ((RAAssignment *)pFStack_448,(RegGroup)pFStack_480,uVar36,uVar39,uVar46);
              pFVar40 = *(FuncNode **)&pFVar27->super_LabelNode;
              pcStack_490 = (code *)0x1245ea;
              pFVar19 = (FuncNode *)
                        (**(code **)(*(long *)(((RARegMask *)&pFVar40->super_LabelNode)->_masks).
                                              _data + 0x48))(pFVar40,pFVar32,uVar39,uVar46);
            }
            pFVar38 = (FuncNode *)0x1;
            bVar55 = (int)pFVar19 == 0;
            pFVar24 = (FuncNode *)(ulong)uStack_484;
            if (!bVar55) {
              pFVar24 = (FuncNode *)((ulong)pFVar19 & 0xffffffff);
            }
            uStack_484 = (uint)pFVar24;
            pFVar25 = pFStack_480;
            pFVar44 = pFStack_470;
            if (bVar55) {
              uVar36 = *(uint *)((Array<unsigned_int_*,_4UL> *)&pFVar34->field_0x8)->_data;
              uVar30 = uVar36 | 0x100;
              pFVar24 = (FuncNode *)(ulong)uVar30;
              *(uint *)((Array<unsigned_int_*,_4UL> *)&pFVar34->field_0x8)->_data = uVar30;
              if ((uVar36 & 2) != 0) {
                pFVar24 = (FuncNode *)((RAAssignment *)&pFVar27->field_0x48)->_physToWorkMap;
                puVar35 = (uint *)((long)(((RARegMask *)&pFVar24->field_0x18)->_masks)._data +
                                  (long)pFStack_480 * 4 + -8);
                *puVar35 = *puVar35 | 1 << (bVar3 & 0x1f);
              }
              pFVar19 = (FuncNode *)(ulong)((int)pFStack_458 - 1);
              pFVar38 = (FuncNode *)0x0;
              pFStack_458 = pFVar19;
            }
          }
LAB_0012466a:
          iVar22 = (int)pFVar38;
          if ((iVar22 != 0) && (iVar22 != 0x25)) {
            if (iVar22 != 0x23) {
              pFStack_440 = (FuncNode *)CONCAT44(pFStack_440._4_4_,(int)pFStack_458);
              pFVar19 = pFVar43;
              unaff_R15 = pFVar52;
              goto LAB_001246a9;
            }
            break;
          }
          pFVar48 = (FuncNode *)&pFVar48->field_0x1;
        } while (pFVar48 != uStack_460);
      }
      pFStack_430 = (FuncNode *)
                    CONCAT44(pFStack_430._4_4_,
                             (int)CONCAT71((int7)((ulong)pFVar19 >> 8),
                                           (int)pFStack_440 == (int)pFStack_458));
      pFVar38 = (FuncNode *)0x0;
      pFStack_440 = (FuncNode *)CONCAT44(pFStack_440._4_4_,(int)pFStack_458);
      pFVar24 = pFStack_458;
      pFVar19 = pFVar43;
      unaff_R15 = pFVar52;
LAB_001246a9:
      if ((int)pFVar38 != 0) goto LAB_001246d1;
      pFVar43 = pFVar19;
      pFVar52 = unaff_R15;
    } while ((int)pFStack_440 != 0);
    pFVar38 = (FuncNode *)0x0;
LAB_001246d1:
    if ((int)pFVar38 != 0) goto LAB_00124d0e;
  }
  if (uStack_44c != 0) {
    unaff_R15 = (FuncNode *)(ulong)uStack_44c;
    pFVar27 = (FuncNode *)0x0;
    pFVar34 = (FuncNode *)(ulong)uStack_44c;
    pFVar49 = (FuncNode *)(ulong)uStack_434;
    while( true ) {
      pFVar43 = (FuncNode *)auStack_3b8[(long)pFVar27];
      uVar36 = (((Layout *)&pFVar43->super_LabelNode)->physIndex).super_RARegCount.field_0._packed;
      if ((ulong)uVar36 == 0xffffffff) goto LAB_00124d7e;
      pFVar23 = pFVar24;
      if ((((RAAssignment *)&pFStack_478->field_0x48)->_layout).workCount <= uVar36) break;
      bVar21 = ((RAAssignment *)&pFStack_478->field_0x48)->_workToPhysMap[uVar36].physIds[0];
      pFVar32 = (FuncNode *)(ulong)bVar21;
      uVar30 = (uint)bVar21;
      if (uVar30 != 0xff) {
        pFVar38 = (FuncNode *)((ulong)pFStack_480 & 0xff);
        pFVar24 = (FuncNode *)(ulong)uVar30;
        pcStack_490 = (code *)0x124737;
        pFVar40 = pFStack_448;
        RAAssignment::unassign((RAAssignment *)pFStack_448,(RegGroup)pFStack_480,uVar36,uVar30);
        pFVar49 = (FuncNode *)(ulong)((uint)pFVar49 & ~(1 << (bVar21 & 0x1f)));
      }
      pFVar34 = (FuncNode *)
                (ulong)((int)pFVar34 + -1 + (uint)((*(uint *)&pFVar43->field_0x8 >> 3 & 1) != 0));
      pFVar27 = (FuncNode *)&pFVar27->field_0x1;
      if (unaff_R15 == pFVar27) goto LAB_00124757;
    }
    goto LAB_00124d83;
  }
  pFVar34 = (FuncNode *)0x0;
  pFVar49 = (FuncNode *)(ulong)uStack_434;
  pFVar43 = pFVar23;
LAB_00124757:
  pFVar27 = pFStack_478;
  pFVar25 = pFStack_480;
  if ((int)pFVar49 != 0) {
    do {
      uVar36 = 0;
      uVar30 = (uint)pFVar49;
      if (uVar30 != 0) {
        for (; (uVar30 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
        }
      }
      uVar29 = *(uint *)(*(long *)(&pFVar27->field_0x48 + (long)pFVar25 * 8 + 0x28) +
                        (ulong)uVar36 * 4);
      unaff_R15 = (FuncNode *)(ulong)uVar29;
      if (uVar29 == 0xffffffff) {
        pFVar38 = (FuncNode *)0x38;
      }
      else {
        if ((*(uint *)(*(long *)(&pFVar27->field_0x48 + 0x20) + 0x10 + (long)pFVar25 * 4) >>
             (uVar36 & 0x1f) & 1) == 0) {
LAB_001247a4:
          pcStack_490 = (code *)0x1247b6;
          pFVar40 = pFStack_448;
          RAAssignment::unassign((RAAssignment *)pFStack_448,(RegGroup)pFVar25,uVar29,uVar36);
          uVar39 = 0;
        }
        else {
          pcStack_490 = (code *)0x12479b;
          pFVar40 = pFVar27;
          uVar39 = onSaveReg((RALocalAllocator *)pFVar27,(RegGroup)pFVar25,uVar29,uVar36);
          pFVar25 = pFStack_480;
          if (uVar39 == 0) goto LAB_001247a4;
        }
        pFVar38 = (FuncNode *)(ulong)(uVar39 != 0);
        if (uVar39 != 0) {
          uStack_484 = uVar39;
        }
        pFVar24 = (FuncNode *)(ulong)uStack_484;
        pFVar25 = pFStack_480;
      }
      if (((int)pFVar38 != 0x38) && ((int)pFVar38 != 0)) goto LAB_001247f2;
      uVar30 = uVar30 - 1 & uVar30;
      pFVar49 = (FuncNode *)(ulong)uVar30;
    } while (uVar30 != 0);
    pFVar38 = (FuncNode *)0x0;
LAB_001247f2:
    if ((int)pFVar38 != 0) goto LAB_00124d0e;
  }
  if ((int)uStack_420 != 0) {
    uVar28 = (ulong)uStack_420 & 0xffffffff;
    uVar41 = 0;
    do {
      puVar35 = (uint *)auStack_2b8[uVar41];
      pFVar43 = (FuncNode *)(ulong)puVar35[4];
      if (puVar35[4] != 0) {
        uVar36 = *puVar35;
        bVar21 = *(byte *)((long)puVar35 + 0xe);
        unaff_R15 = (FuncNode *)(ulong)bVar21;
        do {
          uVar30 = 0;
          uVar29 = (uint)pFVar43;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          if (uVar30 != bVar21) {
            pFVar40 = *(FuncNode **)&pFStack_478->super_LabelNode;
            pFVar38 = (FuncNode *)(ulong)uVar36;
            pFVar24 = (FuncNode *)(ulong)(uint)bVar21;
            pcStack_490 = (code *)0x12483c;
            (**(code **)(*(long *)(((RARegMask *)&pFVar40->super_LabelNode)->_masks)._data + 0x48))
                      ();
          }
          uVar29 = uVar29 - 1 & uVar29;
          pFVar43 = (FuncNode *)(ulong)uVar29;
        } while (uVar29 != 0);
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 != uVar28);
  }
  pFVar25 = pFStack_480;
  if ((pFStack_480 != (FuncNode *)0x1) || (pFVar24 = pFStack_3c8, pFStack_3c8->field_0x10 != '\x12')
     ) {
LAB_00124959:
    uStack_434 = uStack_434 | uStack_464;
    pFVar44 = pFStack_478;
    if ((int)pFVar34 == 0) {
LAB_00124d03:
      puVar35 = (uint *)((long)((Array<unsigned_int_*,_4UL> *)&pFVar44->field_0x28)->_data +
                        (long)pFVar25 * 4);
      *puVar35 = *puVar35 | uStack_434;
      pFVar38 = (FuncNode *)0x0;
      pFVar27 = pFVar44;
      goto LAB_00124d0e;
    }
    uVar36 = (((RAAssignment *)&pFStack_478->field_0x48)->_physToWorkMap->assigned)._masks._data
             [(long)pFVar25];
    pFVar38 = (FuncNode *)(ulong)uVar36;
    iVar22 = (int)pFStack_410;
    pFStack_470 = (FuncNode *)CONCAT44(pFStack_470._4_4_,uVar36);
    pFVar49 = pFStack_410;
    if (iVar22 != 0) {
      pFVar24 = (FuncNode *)CONCAT71((int7)((ulong)pFVar24 >> 8),1);
      if ((*(byte *)(auStack_3f8._16_8_ + 9) & 8) != 0) {
        uVar36 = *(uint *)(auStack_3f8._16_8_ + 0x14);
        if (uVar36 == 0) {
          unaff_R15 = (FuncNode *)0xffffffff;
        }
        else {
          uVar30 = *(uint *)((long)(((RARegMask *)&pFStack_478->field_0x18)->_masks)._data +
                            (long)pFVar25 * 4);
          pFVar38 = (FuncNode *)(ulong)uVar30;
          pFVar40 = *(FuncNode **)&pFStack_478->super_LabelNode;
          pFVar42 = (FuncNode *)((ulong)pFStack_410 & 0xffffffff);
          pFVar19 = (FuncNode *)0x0;
          unaff_R15 = (FuncNode *)0xffffffff;
          uVar29 = uVar36;
          do {
            uVar39 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            if ((uVar36 >> (uVar39 & 0x1f) & 1) != 0) {
              uVar46 = (uint)unaff_R15;
              uStack_460 = (FuncNode *)CONCAT44(uStack_460._4_4_,uVar46);
              pFVar23 = (FuncNode *)(ulong)uVar39;
              pFVar32 = (FuncNode *)0xf;
              unaff_R15 = (FuncNode *)(auStack_3f8 + 0x10);
              pFVar49 = (FuncNode *)0x1;
              do {
                uVar47 = 1 << ((byte)pFVar23 & 0x1f) & uVar30;
                pFVar27 = (FuncNode *)(ulong)uVar47;
                if (uVar47 == 0) {
                  pFVar32 = (FuncNode *)0x0;
                }
                else {
                  pFVar43 = (FuncNode *)(ulong)**(uint **)&unaff_R15->super_LabelNode;
                  if (*(uint *)(&pFVar40->field_0x100 + 0x48) <=
                      **(uint **)&unaff_R15->super_LabelNode) goto LAB_00124d88;
                  bVar55 = pFVar23 ==
                           (FuncNode *)
                           (ulong)*(byte *)(*(long *)(*(long *)(&pFVar40->field_0x100 + 0x40) +
                                                     (long)pFVar43 * 8) + 0x4a);
                  pFVar43 = (FuncNode *)(ulong)bVar55;
                  pFVar32 = (FuncNode *)(ulong)((int)pFVar32 + (uint)bVar55);
                  pFVar25 = pFStack_480;
                }
                if (uVar47 == 0) break;
                unaff_R15 = (FuncNode *)&unaff_R15->field_0x8;
                pFVar23 = (FuncNode *)&pFVar23->field_0x1;
                bVar55 = pFVar49 < pFVar42;
                pFVar25 = pFStack_480;
                pFVar49 = (FuncNode *)&pFVar49->field_0x1;
              } while (bVar55);
              if ((uint)pFVar19 < (uint)pFVar32) {
                uVar46 = uVar39;
                pFVar19 = pFVar32;
              }
              unaff_R15 = (FuncNode *)(ulong)uVar46;
            }
            uVar29 = uVar29 - 1 & uVar29;
            pFVar24 = (FuncNode *)(ulong)uVar29;
          } while (uVar29 != 0);
        }
        iVar50 = (int)unaff_R15;
        pFVar24 = (FuncNode *)CONCAT71((int7)((ulong)pFVar24 >> 8),iVar50 != -1);
        if (iVar50 == -1) {
          uStack_484 = 0x3d;
          pFVar49 = pFStack_410;
        }
        else {
          pFVar49 = (FuncNode *)(ulong)(iVar22 + (uint)(iVar22 == 0));
          lVar16 = 0;
          do {
            uVar36 = iVar50 + (int)lVar16;
            pFVar40 = (FuncNode *)(ulong)uVar36;
            *(char *)(*(long *)(auStack_3f8 + lVar16 * 8 + 0x10) + 0xf) = (char)uVar36;
            lVar16 = lVar16 + 1;
            pFVar25 = pFStack_480;
          } while (pFVar49 != (FuncNode *)lVar16);
        }
      }
      pFVar38 = (FuncNode *)0x1;
      if ((char)pFVar24 != '\0') goto LAB_00124ade;
LAB_00124cff:
      pFVar27 = pFVar44;
      if ((int)pFVar38 != 0) goto LAB_00124d0e;
      goto LAB_00124d03;
    }
LAB_00124ade:
    pFVar23 = (FuncNode *)(ulong)uStack_44c;
    if (uStack_44c != 0) {
      pFVar43 = (FuncNode *)0x0;
      uStack_460 = (FuncNode *)((ulong)uStack_460._4_4_ << 0x20);
      pFVar32 = pFVar23;
      uStack_420 = pFVar23;
      while( true ) {
        pFVar49 = (FuncNode *)auStack_3b8[(long)pFVar43];
        uVar36 = *(uint *)((Array<unsigned_int_*,_4UL> *)&pFVar49->field_0x8)->_data;
        pFVar27 = (FuncNode *)(ulong)uVar36;
        pFVar38 = (FuncNode *)0x4e;
        pFVar44 = pFStack_478;
        if ((uVar36 & 8) != 0) break;
LAB_00124cbe:
        if (((int)pFVar38 != 0x4e) && ((int)pFVar38 != 0)) goto LAB_00124cff;
        pFVar43 = (FuncNode *)&pFVar43->field_0x1;
        if (pFVar23 == pFVar43) {
          bVar55 = (int)pFVar34 == 0;
          pFVar24 = pFVar23;
          pFVar23 = pFVar32;
          pFVar27 = pFVar44;
          goto LAB_00124ce8;
        }
      }
      uVar30 = (((Layout *)&pFVar49->super_LabelNode)->physIndex).super_RARegCount.field_0._packed;
      pFVar32 = (FuncNode *)(ulong)uVar30;
      if (pFVar32 == (FuncNode *)0xffffffff) goto LAB_00124da6;
      if ((((RAAssignment *)&pFStack_478->field_0x48)->_layout).workCount <= uVar30)
      goto LAB_00124dab;
      bVar21 = (((RAAssignment *)&pFStack_478->field_0x48)->_workToPhysMap + -0x18)
               [(long)&((RARegMask *)&pFVar32->field_0x18)->_masks].physIds[0];
      pFVar26 = (FuncNode *)(ulong)bVar21;
      if (bVar21 != 0xff) {
        pFVar38 = (FuncNode *)((ulong)pFVar25 & 0xff);
        pcStack_490 = (code *)0x124b57;
        pFVar40 = pFStack_448;
        RAAssignment::unassign((RAAssignment *)pFStack_448,(RegGroup)pFVar25,uVar30,(uint)bVar21);
        pFVar25 = pFStack_480;
      }
      pFVar27 = pFStack_478;
      bVar21 = *(byte *)((long)((Array<unsigned_int_*,_4UL> *)&pFVar49->field_0x8)->_data + 7);
      unaff_R15 = (FuncNode *)(ulong)bVar21;
      pFVar24 = unaff_R15;
      if (bVar21 != 0xff) {
LAB_00124c4e:
        uVar36 = (uint)pFVar24;
        pFVar23 = pFVar26;
        unaff_R15 = pFVar24;
        if (0x1f < uVar36) goto LAB_00124db0;
        pRVar12 = (RAAssignment *)&pFVar27->field_0x48;
        uVar29 = 1 << ((byte)pFVar24 & 0x1f);
        pFVar27 = (FuncNode *)(ulong)uVar29;
        if (((pRVar12->_physToWorkMap->assigned)._masks._data[(long)pFVar25] >> (uVar36 & 0x1f) & 1)
            == 0) {
          if (((ulong)((Array<unsigned_int_*,_4UL> *)&pFVar49->field_0x8)->_data[0] & 0x40000) == 0)
          {
            pFVar42 = (FuncNode *)0x1;
            pcStack_490 = (code *)0x124c95;
            pFVar40 = pFStack_448;
            RAAssignment::assign((RAAssignment *)pFStack_448,(RegGroup)pFVar25,uVar30,uVar36,true);
            pFVar25 = pFStack_480;
          }
          *(byte *)((long)((Array<unsigned_int_*,_4UL> *)&pFVar49->field_0x8)->_data + 7) =
               (byte)pFVar24;
          pbVar1 = (byte *)((long)((Array<unsigned_int_*,_4UL> *)&pFVar49->field_0x8)->_data + 1);
          *pbVar1 = *pbVar1 | 2;
          uStack_460 = (FuncNode *)CONCAT44(uStack_460._4_4_,(uint)uStack_460 | uVar29);
          pFStack_470 = (FuncNode *)CONCAT44(pFStack_470._4_4_,(uint)pFStack_470 & ~uVar29);
          pFVar34 = (FuncNode *)(ulong)((int)pFVar34 - 1);
          pFVar38 = (FuncNode *)0x0;
          pFVar23 = uStack_420;
          pFVar44 = pFStack_478;
          goto LAB_00124cbe;
        }
        goto LAB_00124db5;
      }
      uVar36 = ~((int)(short)uVar36 >> 0xf & uStack_464 | (uint)uStack_460) &
               *(uint *)((long)&pFVar49->field_0x10 + 4);
      uVar41 = (ulong)uVar36;
      uVar29 = ~(uint)pFStack_470 & uVar36;
      pFVar42 = (FuncNode *)(ulong)uVar29;
      pFVar40 = pFStack_478;
      if (uVar29 != 0) {
        pcStack_490 = (code *)0x124baa;
        uVar14 = decideOnAssignment((RALocalAllocator *)pFStack_478,(RegGroup)pFVar25,uVar30,uVar36,
                                    uVar29);
        unaff_R15 = (FuncNode *)(ulong)uVar14;
        pFVar26 = (FuncNode *)CONCAT71((int7)(uVar41 >> 8),1);
LAB_00124c40:
        pFVar38 = (FuncNode *)0x1;
        pFVar23 = uStack_420;
        pFVar25 = pFStack_480;
        pFVar44 = pFVar27;
        pFVar24 = unaff_R15;
        if ((char)pFVar26 == '\0') goto LAB_00124cbe;
        goto LAB_00124c4e;
      }
      pFVar24 = (FuncNode *)(ulong)(uVar36 & (uint)pFStack_470);
      pFVar38 = (FuncNode *)((ulong)pFVar25 & 0xff);
      pFStack_458 = (FuncNode *)CONCAT44(pFStack_458._4_4_,(int)pFVar38);
      pFVar42 = (FuncNode *)auStack_3f8;
      pcStack_490 = (code *)0x124bd2;
      uVar14 = decideOnSpillFor((RALocalAllocator *)pFStack_478,(RegGroup)pFVar25,(uint32_t)pFVar25,
                                uVar36 & (uint)pFStack_470,(uint32_t *)pFVar42);
      workId = auStack_3f8._0_4_;
      if (uVar14 < 0x20) {
        unaff_R15 = (FuncNode *)(ulong)uVar14;
        RVar13 = (RegGroup)pFStack_458;
        if ((*(uint *)(*(long *)(&pFVar27->field_0x48 + 0x20) + 0x10 + (long)pFStack_480 * 4) >>
             (uVar14 & 0x1f) & 1) == 0) {
LAB_00124c1c:
          pcStack_490 = (code *)0x124c29;
          pFVar27 = unaff_R15;
          pFVar40 = pFStack_448;
          RAAssignment::unassign((RAAssignment *)pFStack_448,RVar13,workId,uVar14);
          uVar36 = 0;
        }
        else {
          pFVar27 = (FuncNode *)(ulong)uVar14;
          pcStack_490 = (code *)0x124c11;
          pFVar40 = pFStack_478;
          uVar36 = onSaveReg((RALocalAllocator *)pFStack_478,RVar13,auStack_3f8._0_4_,uVar14);
          RVar13 = (RegGroup)pFStack_458;
          if (uVar36 == 0) goto LAB_00124c1c;
        }
        pFVar26 = (FuncNode *)CONCAT71((int7)((ulong)pFVar27 >> 8),uVar36 == 0);
        pFVar27 = pFStack_478;
        if (uVar36 != 0) {
          uStack_484 = uVar36;
        }
        goto LAB_00124c40;
      }
      goto LAB_00124dba;
    }
    bVar55 = false;
    uStack_460 = (FuncNode *)((ulong)uStack_460._4_4_ << 0x20);
    pFVar27 = pFStack_478;
LAB_00124ce8:
    pFVar34 = (FuncNode *)0x0;
    pFVar32 = pFVar23;
    if (bVar55) {
      uStack_434 = uStack_434 | (uint)uStack_460;
      pFVar38 = (FuncNode *)0x0;
      pFVar44 = pFVar27;
      goto LAB_00124cff;
    }
    goto LAB_00124dbf;
  }
  uVar36 = (((RAAssignment *)&pFStack_478->field_0x48)->_physToWorkMap->assigned)._masks._data[1] &
           *(uint *)&((RAAssignment *)&pFStack_3c8->field_0x90)->_workToPhysMap;
  if (uVar36 != 0) {
    bVar21 = *(byte *)((long)(((RAAssignment *)&pFStack_3c8->field_0x48)->_physToWorkIds)._data +
                      0x1d);
    pFVar27 = (FuncNode *)(ulong)bVar21;
    do {
      pFVar49 = (FuncNode *)(ulong)uVar36;
      uVar30 = 0;
      if (uVar36 != 0) {
        for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
        }
      }
      pFVar26 = (FuncNode *)(ulong)uVar30;
      uVar29 = *(uint *)(*(long *)(&pFStack_478->field_0x48 + (long)pFVar25 * 8 + 0x28) +
                        (long)pFVar26 * 4);
      unaff_R15 = (FuncNode *)(ulong)uVar29;
      pFVar23 = pFStack_478;
      if (*(uint *)(*(long *)&pFStack_478->super_LabelNode + 0x148) <= uVar29) goto LAB_00124d9c;
      pFVar24 = (FuncNode *)CONCAT71((int7)((ulong)pFStack_478 >> 8),1);
      if ((uint)bVar21 <
          *(uint *)(*(long *)(*(long *)(*(long *)(*(long *)&pFStack_478->super_LabelNode + 0x140) +
                                       (long)unaff_R15 * 8) + 8) + 8)) {
        if ((*(uint *)(*(long *)(&pFStack_478->field_0x48 + 0x20) + 0x10 + (long)pFVar25 * 4) >>
             (uVar30 & 0x1f) & 1) == 0) {
LAB_001248f9:
          pFVar38 = (FuncNode *)0x1;
          pcStack_490 = (code *)0x12490d;
          pFVar40 = pFStack_448;
          RAAssignment::unassign((RAAssignment *)pFStack_448,kVec,uVar29,uVar30);
          uVar39 = 0;
          pFVar25 = pFVar26;
        }
        else {
          pFVar38 = (FuncNode *)0x1;
          pFVar25 = (FuncNode *)(ulong)uVar30;
          pcStack_490 = (code *)0x1248f5;
          pFVar40 = pFStack_478;
          uVar39 = onSaveReg((RALocalAllocator *)pFStack_478,kVec,uVar29,uVar30);
          if (uVar39 == 0) goto LAB_001248f9;
        }
        pFVar24 = (FuncNode *)CONCAT71((int7)((ulong)pFVar25 >> 8),uVar39 == 0);
        pFVar25 = pFStack_480;
        if (uVar39 != 0) {
          uStack_484 = uVar39;
        }
      }
      if ((char)pFVar24 == '\0') {
        pFVar24 = (FuncNode *)0x0;
        goto LAB_00124947;
      }
      uVar36 = uVar36 - 1 & uVar36;
      if (uVar36 == 0) goto LAB_00124947;
    } while( true );
  }
  pFVar24 = (FuncNode *)CONCAT71((int7)((ulong)pFStack_3c8 >> 8),1);
LAB_00124947:
  pFVar38 = (FuncNode *)0x1;
  pFVar27 = pFStack_478;
  if ((char)pFVar24 == '\0') goto LAB_00124d0e;
  goto LAB_00124959;
LAB_00124d0e:
  iVar22 = (int)pFVar38;
  if (iVar22 != 0) goto LAB_00124d24;
  pFVar25 = (FuncNode *)&pFVar25->field_0x1;
  if (pFVar25 == (FuncNode *)0x4) {
    iVar22 = 2;
LAB_00124d24:
    if (iVar22 == 2) {
      uStack_484 = 0;
    }
    return uStack_484;
  }
  goto LAB_0012378e;
  while( true ) {
    puVar35 = puVar35 + 8;
    uVar28 = uVar28 - 1;
    if (uVar28 == 0) break;
LAB_00124e97:
    if (*puVar35 == extraout_EDX_00) goto LAB_00124eab;
  }
LAB_00124ea9:
  puVar35 = (uint *)0x0;
LAB_00124eab:
  if ((puVar35 == (uint *)0x0) || ((puVar35[2] & 0x40008) == 0)) {
    if ((*(byte *)(lVar16 + 0x24) & 4) == 0) {
      uVar30 = ~*(uint *)(lVar16 + 0x38) & uVar30;
      if (uVar30 != 0) {
        uVar29 = ~*(uint *)(&pFVar40->field_0x38 + uVar41 * 4) & uVar30;
        if (uVar29 == 0) {
          uVar29 = uVar30;
        }
        uVar36 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
      }
      if (uVar30 != 0) {
        return uVar36;
      }
    }
    uVar36 = 0xff;
  }
  else {
    uVar36 = 0;
    if (uVar30 != 0) {
      for (; (uVar30 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
      }
    }
  }
  return uVar36;
LAB_00124d47:
  pcStack_490 = (code *)0x124d4c;
  allocInst();
LAB_00124d4c:
  pcStack_490 = (code *)0x124d51;
  allocInst();
LAB_00124d51:
  pcStack_490 = (code *)0x124d56;
  allocInst();
  pFVar44 = pFVar27;
  pFVar49 = pFVar23;
LAB_00124d56:
  pFVar23 = pFVar24;
  pcStack_490 = (code *)0x124d5b;
  allocInst();
LAB_00124d5b:
  pcStack_490 = (code *)0x124d60;
  allocInst();
  pFVar26 = pFVar32;
  pFVar19 = pFVar43;
  pFVar27 = pFVar44;
  pFVar43 = pFVar49;
  unaff_R15 = pFVar52;
LAB_00124d60:
  pcStack_490 = (code *)0x124d65;
  allocInst();
LAB_00124d65:
  pcStack_490 = (code *)0x124d6a;
  allocInst();
LAB_00124d6a:
  pcStack_490 = (code *)0x124d6f;
  allocInst();
  pFVar24 = pFVar23;
  pFVar32 = pFVar26;
  pFVar17 = pFVar43;
  pFVar49 = pFVar48;
LAB_00124d6f:
  pcStack_490 = (code *)0x124d74;
  allocInst();
LAB_00124d74:
  pcStack_490 = (code *)0x124d79;
  allocInst();
  pFVar43 = pFVar17;
LAB_00124d79:
  pcStack_490 = (code *)0x124d7e;
  allocInst();
LAB_00124d7e:
  pcStack_490 = (code *)0x124d83;
  allocInst();
  pFVar23 = pFVar24;
LAB_00124d83:
  pcStack_490 = (code *)0x124d88;
  allocInst();
LAB_00124d88:
  pcStack_490 = (code *)0x124d8d;
  allocInst();
  pFVar26 = pFVar32;
LAB_00124d8d:
  pcStack_490 = (code *)0x124d92;
  allocInst();
LAB_00124d92:
  pcStack_490 = (code *)0x124d97;
  allocInst();
LAB_00124d97:
  pcStack_490 = (code *)0x124d9c;
  allocInst();
LAB_00124d9c:
  pcStack_490 = (code *)0x124da1;
  allocInst();
  pFVar32 = pFVar26;
LAB_00124da1:
  pcStack_490 = (code *)0x124da6;
  allocInst();
LAB_00124da6:
  pcStack_490 = (code *)0x124dab;
  allocInst();
LAB_00124dab:
  pcStack_490 = (code *)0x124db0;
  allocInst();
LAB_00124db0:
  pFVar24 = pFVar23;
  pcStack_490 = (code *)0x124db5;
  allocInst();
LAB_00124db5:
  pcStack_490 = (code *)0x124dba;
  allocInst();
LAB_00124dba:
  pcStack_490 = (code *)0x124dbf;
  allocInst();
LAB_00124dbf:
  pcStack_490 = decideOnAssignment;
  allocInst();
  uVar36 = (uint)pFVar42;
  if (uVar36 == 0) {
    pcStack_498 = (code *)0x124e1c;
    decideOnAssignment();
LAB_00124e1c:
    pcStack_498 = (code *)0x124e21;
    decideOnAssignment();
  }
  else {
    lVar16 = *(long *)(((RARegMask *)&pFVar40->super_LabelNode)->_masks)._data;
    if (*(uint *)(lVar16 + 0x148) <= extraout_EDX) goto LAB_00124e1c;
    pFVar24 = *(FuncNode **)(*(long *)(lVar16 + 0x140) + (ulong)extraout_EDX * 8);
    bVar21 = (((RAAssignment *)&pFVar24->field_0x48)->_layout).physIndex.super_RARegCount.field_0.
             _regs[2];
    if ((bVar21 != 0xff) && ((uVar36 >> (bVar21 & 0x1f) & 1) != 0)) {
      return (uint)bVar21;
    }
    if ((byte)pFVar38 < 4) {
      uVar30 = (((RARegMask *)&pFVar24->field_0x38)->_masks)._data[1] & uVar36;
      if (uVar30 == 0) {
        uVar30 = uVar36;
      }
      uVar36 = ~*(uint *)(&pFVar40->field_0x38 + ((ulong)pFVar38 & 0xff) * 4) & uVar30;
      if (uVar36 == 0) {
        uVar36 = uVar30;
      }
      uVar30 = 0;
      if (uVar36 != 0) {
        for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
        }
      }
      return uVar30;
    }
  }
  uVar36 = (uint)pFVar24;
  pcStack_498 = decideOnReassignment;
  decideOnAssignment();
  uVar30 = (uint)pFVar42;
  if (uVar30 == 0) {
    pFStack_4a0 = (FuncNode *)0x124ef1;
    decideOnReassignment();
  }
  else {
    lVar16 = *(long *)(((RARegMask *)&pFVar40->super_LabelNode)->_masks)._data;
    if (extraout_EDX_00 < *(uint *)(lVar16 + 0x148)) {
      lVar16 = *(long *)(*(long *)(lVar16 + 0x140) + (ulong)extraout_EDX_00 * 8);
      bVar21 = *(byte *)(lVar16 + 0x4a);
      if ((bVar21 != 0xff) && ((uVar30 >> (bVar21 & 0x1f) & 1) != 0)) {
        return (uint)bVar21;
      }
      uVar36 = extraout_EDX_00;
      if ((byte)pFVar38 < 4) {
        uVar41 = (ulong)pFVar38 & 0xff;
        uVar36 = (uint)uVar41;
        uVar28 = (ulong)*(byte *)((long)(((RARegMask *)&pFVar19->field_0x18)->_masks)._data + uVar41
                                 );
        if (uVar28 == 0) goto LAB_00124ea9;
        puVar35 = (uint *)((long)(((RAAssignment *)&pFVar19->field_0x48)->_physToWorkIds)._data +
                          ((ulong)((*(uint *)((long)&pFVar19->field_0x10 + 4) >>
                                    ((byte)pFVar38 * '\b' & 0x1f) & 0xff) << 5) - 0x24));
        goto LAB_00124e97;
      }
      goto LAB_00124ef6;
    }
  }
  pFStack_4a0 = (FuncNode *)0x124ef6;
  decideOnReassignment();
LAB_00124ef6:
  pFStack_4a0 = (FuncNode *)0x124efb;
  decideOnReassignment();
  pFVar25 = unaff_R15;
  pFStack_4c0 = pFVar32;
  pFStack_4b8 = pFVar27;
  pFStack_4b0 = pFVar49;
  pFStack_4a8 = unaff_R15;
  pFStack_4a0 = pFVar34;
  if (uVar36 == 0) goto LAB_00124fda;
  if (3 < (byte)pFVar38) goto LAB_00124fdf;
  uVar30 = 0;
  if (uVar36 != 0) {
    for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
    }
  }
  uVar41 = (ulong)pFVar38 & 0xff;
  pFVar38 = *(FuncNode **)(&pFVar40->field_0x48 + uVar41 * 8 + 0x28);
  uVar29 = *(uint *)((long)(((RARegMask *)&pFVar38->field_0x18)->_masks)._data +
                    (ulong)uVar30 * 4 + -0x18);
  pFVar19 = (FuncNode *)(ulong)uVar29;
  uVar36 = uVar36 - 1 & uVar36;
  if (uVar36 != 0) {
    lVar16 = *(long *)(((RARegMask *)&pFVar40->super_LabelNode)->_masks)._data;
    uVar39 = *(uint *)(lVar16 + 0x148);
    if (uVar39 <= uVar29) {
LAB_00124fe4:
      pFStack_4c8 = (FuncNode *)0x124fe9;
      decideOnSpillFor();
      pPVar33 = *(PhysToWorkMap **)((long)(((RARegMask *)&pFVar38->field_0x18)->_masks)._data + 8);
      node_00 = (InstNode *)(ulong)(pPVar33->dirty)._masks._data[0];
      if (node_00 != (InstNode *)0x0) {
        pFStack_508 = (FuncNode *)&pFVar40->field_0x48;
        puVar35 = pPVar33[2].assigned._masks._data + 3;
        pIVar53 = (InstNode *)0x0;
        pFVar19 = pFVar40;
        pIStack_500 = node_00;
        pFStack_4f8 = pFVar38;
        pFStack_4f0 = pFVar32;
        pFStack_4e8 = pFVar27;
        pFStack_4e0 = pFVar43;
        pFStack_4d8 = pFVar49;
        pFStack_4d0 = pFVar25;
        pFStack_4c8 = pFVar34;
        do {
          if ((InstNode *)(ulong)(pPVar33->dirty)._masks._data[0] <= pIVar53) {
            puStack_520 = (uint *)0x125140;
            spillAfterAllocation();
LAB_00125140:
            puStack_520 = (uint *)0x125145;
            spillAfterAllocation();
LAB_00125145:
            puStack_520 = (uint *)0x12514a;
            spillAfterAllocation();
LAB_0012514a:
            puStack_520 = (uint *)0x12514f;
            spillAfterAllocation();
LAB_0012514f:
            puStack_520 = (uint *)0x125154;
            spillAfterAllocation();
LAB_00125154:
            puStack_520 = (uint *)0x125159;
            spillAfterAllocation();
            *(undefined8 *)(*(long *)&pFVar19->field_0x8 + 0x198) = *(undefined8 *)node_00;
            pPStack_548 = pPVar33;
            pFStack_540 = pFVar27;
            pFStack_538 = pFVar43;
            pFStack_530 = pFVar40;
            pIStack_528 = pIVar53;
            puStack_520 = puVar35;
            if (*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) {
              EVar15 = switchToAssignment((RALocalAllocator *)pFVar19,
                                          *(PhysToWorkMap **)(block + 200),
                                          (ZoneBitVector *)(block + 0x78),
                                          SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true);
              pPVar33 = (PhysToWorkMap *)(ulong)EVar15;
              if (EVar15 != 0) {
                return EVar15;
              }
            }
            EVar15 = allocInst((RALocalAllocator *)pFVar19,node_00);
            if (EVar15 != 0) {
              return EVar15;
            }
            uVar36 = *(uint *)(block + 0xb8);
            if ((ulong)uVar36 == 0xffffffff) {
              pRVar20 = block + 0xbc;
LAB_001251fe:
              EVar15 = spillScratchGpRegsBeforeEntry
                                 ((RALocalAllocator *)pFVar19,*(RegMask *)pRVar20);
              if (EVar15 != 0) {
                return EVar15;
              }
              if (*(long *)(block + 200) == 0) {
                EVar15 = BaseRAPass::setBlockEntryAssignment
                                   (*(BaseRAPass **)&pFVar19->super_LabelNode,block,
                                    *(RABlock **)&pFVar19->field_0xd8,
                                    (RAAssignment *)&pFVar19->field_0x48);
                if (EVar15 != 0) {
                  return EVar15;
                }
                goto LAB_001253c0;
              }
              node = *(BaseNode **)(*(BaseRAPass **)&pFVar19->super_LabelNode)->_extraBlock;
              pRVar20 = (RABlock *)BaseBuilder::setCursor(*(BaseBuilder **)&pFVar19->field_0x8,node)
              ;
              __src = *(void **)(&pFVar19->field_0x48 + 0x18);
              memcpy(*(void **)(&pFVar19->field_0x90 + 0x20),*(void **)(&pFVar19->field_0x48 + 0x20)
                     ,(ulong)*(uint *)(&pFVar19->field_0x90 + 8) * 4 + 0x20);
              memcpy(*(void **)(&pFVar19->field_0x90 + 0x18),__src,
                     (ulong)*(uint *)(&pFVar19->field_0x90 + 0xc));
              bVar55 = false;
              EVar15 = switchToAssignment((RALocalAllocator *)pFVar19,
                                          *(PhysToWorkMap **)(block + 200),
                                          (ZoneBitVector *)(block + 0x78),
                                          SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
              if (EVar15 != 0) goto LAB_001253bb;
              EVar15 = (Error)pPVar33;
              if ((BaseNode *)(*(long **)&pFVar19->field_0x8)[0x33] != node) {
                if ((uint)(byte)node_00[0x13] <= (byte)node_00[0x12] - 1) goto LAB_001253d8;
                lVar16 = (ulong)((byte)node_00[0x12] - 1) * 0x10;
                if ((*(uint *)(node_00 + lVar16 + 0x40) & 7) != 5) goto LAB_001253dd;
                (**(code **)(**(long **)&pFVar19->field_0x8 + 0x20))(&uStack_570);
                uStack_560 = *(undefined8 *)(node_00 + lVar16 + 0x40);
                uStack_558 = *(undefined8 *)(node_00 + lVar16 + 0x48);
                *(undefined4 *)(node_00 + lVar16 + 0x40) = uStack_570;
                *(undefined4 *)(node_00 + lVar16 + 0x44) = uStack_56c;
                *(undefined4 *)(node_00 + lVar16 + 0x48) = uStack_568;
                *(undefined4 *)(node_00 + lVar16 + 0x4c) = uStack_564;
                node_00[0x34] = (InstNode)((byte)node_00[0x34] & 0xef);
                EVar15 = (**(code **)(**(long **)&pFVar19->super_LabelNode + 0x68))();
                bVar55 = EVar15 == 0;
                if (bVar55) {
                  plVar7 = *(long **)&pFVar19->field_0x8;
                  plVar7[0x33] = (long)node;
                  (**(code **)(*plVar7 + 0x30))(plVar7,&uStack_570);
                  EVar15 = (Error)pPVar33;
                }
                goto LAB_00125340;
              }
            }
            else {
              if (uVar36 < *(uint *)(*(long *)block + 0xf0)) {
                pRVar20 = (RABlock *)((ulong)uVar36 * 0x20 + *(long *)(*(long *)block + 0xe8));
                goto LAB_001251fe;
              }
              allocBranch();
              pRVar20 = block;
LAB_001253d8:
              allocBranch();
LAB_001253dd:
              EVar15 = 3;
              bVar55 = false;
LAB_00125340:
              if (!bVar55) {
                bVar55 = false;
                goto LAB_001253bb;
              }
            }
            *(RABlock **)(*(long *)&pFVar19->field_0x8 + 0x198) = pRVar20;
            uVar8 = *(undefined8 *)(&pFVar19->field_0x48 + 0x18);
            uVar9 = *(undefined8 *)(&pFVar19->field_0x48 + 0x20);
            uVar10 = *(undefined8 *)(&pFVar19->field_0x90 + 0x20);
            *(undefined8 *)(&pFVar19->field_0x48 + 0x18) =
                 *(undefined8 *)(&pFVar19->field_0x90 + 0x18);
            *(undefined8 *)(&pFVar19->field_0x48 + 0x20) = uVar10;
            *(undefined8 *)(&pFVar19->field_0x90 + 0x18) = uVar8;
            *(undefined8 *)(&pFVar19->field_0x90 + 0x20) = uVar9;
            lVar16 = 0;
            do {
              uVar8 = *(undefined8 *)(&pFVar19->field_0x48 + lVar16 * 8 + 0x28);
              uVar9 = *(undefined8 *)((long)(&pFVar19->field_0x48 + lVar16 * 8 + 0x28) + 8);
              uVar10 = *(undefined8 *)((long)(&pFVar19->field_0x90 + lVar16 * 8 + 0x28) + 8);
              *(undefined8 *)(&pFVar19->field_0x48 + lVar16 * 8 + 0x28) =
                   *(undefined8 *)(&pFVar19->field_0x90 + lVar16 * 8 + 0x28);
              *(undefined8 *)((long)(&pFVar19->field_0x48 + lVar16 * 8 + 0x28) + 8) = uVar10;
              *(undefined8 *)(&pFVar19->field_0x90 + lVar16 * 8 + 0x28) = uVar8;
              *(undefined8 *)((long)(&pFVar19->field_0x90 + lVar16 * 8 + 0x28) + 8) = uVar9;
              lVar16 = lVar16 + 2;
            } while (lVar16 != 4);
            bVar55 = true;
LAB_001253bb:
            if (bVar55) {
LAB_001253c0:
              EVar15 = 0;
            }
            return EVar15;
          }
          bVar55 = true;
          if ((*puVar35 & 0x20000) != 0) {
            uVar36 = puVar35[-2];
            pFVar27 = (FuncNode *)(ulong)uVar36;
            if (*(uint *)(*(long *)&pFVar40->super_LabelNode + 0x148) <= uVar36) goto LAB_00125140;
            lVar16 = *(long *)(*(long *)(*(long *)&pFVar40->super_LabelNode + 0x140) +
                              (long)pFVar27 * 8);
            if (*(char *)(lVar16 + 0x4a) != -1) goto LAB_00125110;
            if (uVar36 == 0xffffffff) goto LAB_00125145;
            if (*(uint *)(&pFVar40->field_0x48 + 0xc) <= uVar36) goto LAB_0012514a;
            bVar21 = (((Layout *)&pFVar27->super_LabelNode)->physIndex).super_RARegCount.field_0.
                     _regs[*(long *)(&pFVar40->field_0x48 + 0x18)];
            pFVar43 = (FuncNode *)(ulong)bVar21;
            if (bVar21 == 0xff) goto LAB_00125110;
            RVar13 = *(RegGroup *)(lVar16 + 0x21);
            *(FuncNode **)(*(long *)&pFVar40->field_0x8 + 0x198) = pFStack_4f8;
            if (0x1f < bVar21) goto LAB_0012514f;
            RVar13 = RVar13 & kMaxValue;
            if (kExtraVirt3 < RVar13) goto LAB_00125154;
            if ((*(uint *)(*(long *)(&pFVar40->field_0x48 + 0x20) + 0x10 + (ulong)RVar13 * 4) >>
                 (bVar21 & 0x1f) & 1) == 0) {
LAB_001250e9:
              puStack_520 = (uint *)0x1250f9;
              pFVar19 = pFStack_508;
              RAAssignment::unassign((RAAssignment *)pFStack_508,RVar13,uVar36,(uint)bVar21);
              EVar15 = 0;
            }
            else {
              puStack_520 = (uint *)0x1250e0;
              pFVar19 = pFVar40;
              uStack_510 = (ulong)RVar13;
              EVar15 = onSaveReg((RALocalAllocator *)pFVar40,RVar13,uVar36,(uint)bVar21);
              RVar13 = (RegGroup)uStack_510;
              if (EVar15 == 0) goto LAB_001250e9;
            }
            bVar55 = EVar15 == 0;
            node_00 = pIStack_500;
            if (!bVar55) {
              EStack_514 = EVar15;
            }
          }
LAB_00125110:
          if (!bVar55) {
            return EStack_514;
          }
          pIVar53 = pIVar53 + 1;
          puVar35 = puVar35 + 8;
        } while (node_00 != pIVar53);
      }
      return 0;
    }
    lVar16 = *(long *)(lVar16 + 0x140);
    uVar47 = (uint)(*(float *)(*(long *)(lVar16 + (long)pFVar19 * 8) + 100) * 1048576.0);
    uVar46 = *(uint *)(*(long *)((long)&pFVar40->field_0x48 + 0x20) + 0x10 + uVar41 * 4);
    pFVar40 = (FuncNode *)(ulong)uVar46;
    uVar29 = uVar47 + 0x40000;
    if ((uVar46 >> (uVar30 & 0x1f) & 1) == 0) {
      uVar29 = uVar47;
    }
    pFVar23 = (FuncNode *)(ulong)uVar29;
    do {
      uVar47 = 0;
      if (uVar36 != 0) {
        for (; (uVar36 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
        }
      }
      pFVar32 = (FuncNode *)(ulong)uVar47;
      uVar29 = *(uint *)((long)(((RARegMask *)&pFVar38->field_0x18)->_masks)._data +
                        (long)pFVar32 * 4 + -0x18);
      pFVar49 = (FuncNode *)(ulong)uVar29;
      if (uVar39 <= uVar29) {
        pFStack_4c8 = (FuncNode *)0x124fda;
        decideOnSpillFor();
LAB_00124fda:
        pFStack_4c8 = (FuncNode *)0x124fdf;
        decideOnSpillFor();
LAB_00124fdf:
        pFStack_4c8 = (FuncNode *)0x124fe4;
        decideOnSpillFor();
        goto LAB_00124fe4;
      }
      uVar29 = (uint)(*(float *)(*(long *)(lVar16 + (long)pFVar49 * 8) + 100) * 1048576.0);
      pFVar25 = (FuncNode *)(ulong)uVar29;
      pFVar27 = (FuncNode *)(ulong)(uVar29 + 0x40000);
      if ((uVar46 >> (uVar47 & 0x1f) & 1) == 0) {
        pFVar27 = pFVar25;
      }
      bVar55 = (uint)pFVar27 < (uint)pFVar23;
      if (bVar55) {
        pFVar19 = pFVar49;
        pFVar23 = pFVar27;
      }
      uVar29 = (uint)pFVar19;
      if (bVar55) {
        uVar30 = uVar47;
      }
      uVar36 = uVar36 - 1 & uVar36;
      pFVar34 = (FuncNode *)(ulong)uVar36;
    } while (uVar36 != 0);
  }
  (((Layout *)&pFVar42->super_LabelNode)->physIndex).super_RARegCount.field_0._packed = uVar29;
  return uVar30;
}

Assistant:

Error RALocalAllocator::makeInitialAssignment() noexcept {
  FuncNode* func = _pass->func();
  RABlock* entry = _pass->entryBlock();

  ZoneBitVector& liveIn = entry->liveIn();
  uint32_t argCount = func->argCount();
  uint32_t numIter = 1;

  for (uint32_t iter = 0; iter < numIter; iter++) {
    for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
      for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
        // Unassigned argument.
        const RegOnly& regArg = func->argPack(argIndex)[valueIndex];
        if (!regArg.isReg() || !_cc->isVirtIdValid(regArg.id()))
          continue;

        VirtReg* virtReg = _cc->virtRegById(regArg.id());

        // Unreferenced argument.
        RAWorkReg* workReg = virtReg->workReg();
        if (!workReg)
          continue;

        // Overwritten argument.
        uint32_t workId = workReg->workId();
        if (!liveIn.bitAt(workId))
          continue;

        RegGroup group = workReg->group();
        if (_curAssignment.workToPhysId(group, workId) != RAAssignment::kPhysNone)
          continue;

        RegMask allocableRegs = _availableRegs[group] & ~_curAssignment.assigned(group);
        if (iter == 0) {
          // First iteration: Try to allocate to home RegId.
          if (workReg->hasHomeRegId()) {
            uint32_t physId = workReg->homeRegId();
            if (Support::bitTest(allocableRegs, physId)) {
              _curAssignment.assign(group, workId, physId, true);
              _pass->_argsAssignment.assignRegInPack(argIndex, valueIndex, workReg->type(), physId, workReg->typeId());
              continue;
            }
          }

          numIter = 2;
        }
        else {
          // Second iteration: Pick any other register if the is an unassigned one or assign to stack.
          if (allocableRegs) {
            uint32_t physId = Support::ctz(allocableRegs);
            _curAssignment.assign(group, workId, physId, true);
            _pass->_argsAssignment.assignRegInPack(argIndex, valueIndex, workReg->type(), physId, workReg->typeId());
          }
          else {
            // This register will definitely need stack, create the slot now and assign also `argIndex`
            // to it. We will patch `_argsAssignment` later after RAStackAllocator finishes.
            RAStackSlot* slot = _pass->getOrCreateStackSlot(workReg);
            if (ASMJIT_UNLIKELY(!slot))
              return DebugUtils::errored(kErrorOutOfMemory);

            // This means STACK_ARG may be moved to STACK.
            workReg->addFlags(RAWorkRegFlags::kStackArgToStack);
            _pass->_numStackArgsToStackSlots++;
          }
        }
      }
    }
  }

  return kErrorOk;
}